

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  long lVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  BVH *bvh;
  ulong uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  size_t k;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [28];
  GridSOA *pGVar71;
  int iVar72;
  ulong uVar73;
  undefined4 uVar74;
  ulong uVar75;
  RTCIntersectArguments *pRVar76;
  long lVar77;
  undefined1 (*pauVar78) [32];
  long lVar79;
  ulong uVar80;
  ulong *puVar81;
  NodeRef root;
  long lVar82;
  bool bVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar101;
  float fVar102;
  float fVar110;
  undefined8 extraout_XMM1_Qa;
  float fVar111;
  undefined1 auVar103 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar109;
  float fVar113;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar112;
  undefined1 auVar108 [32];
  float fVar114;
  undefined1 extraout_var [56];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar152;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar151 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  float fVar165;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  float fVar191;
  undefined1 auVar192 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 in_ZMM14 [64];
  undefined1 auVar193 [64];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float fStack_2e88;
  GridSOA *local_2e68;
  GridSOA *local_2e60;
  GridSOA *local_2e58;
  GridSOA *local_2e50;
  long local_2e18;
  GridSOA *local_2e10;
  GridSOA *local_2e08;
  Precalculations local_2e00;
  RTCFilterFunctionNArguments local_2df0;
  undefined1 local_2dc0 [32];
  undefined1 local_2da0 [32];
  undefined1 local_2d80 [32];
  undefined1 local_2d60 [32];
  undefined1 local_2d40 [32];
  long local_2d20;
  long local_2d18;
  long local_2d10;
  GridSOA *local_2d08;
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [8];
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  undefined4 uStack_2c44;
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [8];
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  uint local_2ac0;
  uint uStack_2abc;
  uint uStack_2ab8;
  uint uStack_2ab4;
  uint uStack_2ab0;
  uint uStack_2aac;
  uint uStack_2aa8;
  uint uStack_2aa4;
  uint local_2aa0;
  uint uStack_2a9c;
  uint uStack_2a98;
  uint uStack_2a94;
  uint uStack_2a90;
  uint uStack_2a8c;
  uint uStack_2a88;
  uint uStack_2a84;
  uint local_2a80;
  uint uStack_2a7c;
  uint uStack_2a78;
  uint uStack_2a74;
  uint uStack_2a70;
  uint uStack_2a6c;
  uint uStack_2a68;
  uint uStack_2a64;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a60;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [8];
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined1 local_26c0 [8];
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar150 [64];
  undefined1 auVar183 [64];
  undefined1 auVar185 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    pRVar76 = (RTCIntersectArguments *)context;
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       (pRVar76 = context->args, ((ulong)*(Scene **)&pRVar76->flags & 0x10000) == 0)) {
      auVar128 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar103 = ZEXT816(0) << 0x40;
      auVar148 = vpcmpeqd_avx2(auVar128,(undefined1  [32])valid_i->field_0);
      auVar128 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar103),5);
      auVar94 = auVar148 & auVar128;
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0x7f,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0xbf,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar94[0x1f] < '\0') {
        auVar128 = vandps_avx(auVar128,auVar148);
        auVar17 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
        local_2e00.super_Precalculations.grid = (GridSOA *)0x0;
        local_2a60._0_8_ = *(undefined8 *)ray;
        local_2a60._8_8_ = *(undefined8 *)(ray + 8);
        local_2a60._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2a60._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2a60._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2a60._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2a60._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2a60._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2a60._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2a60._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2a60._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2a60._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2a00 = *(undefined1 (*) [32])(ray + 0x80);
        local_29e0 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar185._8_4_ = 0x7fffffff;
        auVar185._0_8_ = 0x7fffffff7fffffff;
        auVar185._12_4_ = 0x7fffffff;
        auVar185._16_4_ = 0x7fffffff;
        auVar185._20_4_ = 0x7fffffff;
        auVar185._24_4_ = 0x7fffffff;
        auVar185._28_4_ = 0x7fffffff;
        auVar186 = ZEXT3264(auVar185);
        auVar93._8_4_ = 0x219392ef;
        auVar93._0_8_ = 0x219392ef219392ef;
        auVar93._12_4_ = 0x219392ef;
        auVar93._16_4_ = 0x219392ef;
        auVar93._20_4_ = 0x219392ef;
        auVar93._24_4_ = 0x219392ef;
        auVar93._28_4_ = 0x219392ef;
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = &DAT_3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar188._16_4_ = 0x3f800000;
        auVar188._20_4_ = 0x3f800000;
        auVar188._24_4_ = 0x3f800000;
        auVar188._28_4_ = 0x3f800000;
        local_29c0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar149 = vdivps_avx(auVar188,local_2a00);
        auVar128 = vandps_avx(auVar185,local_2a00);
        auVar94 = vcmpps_avx(auVar128,auVar93,1);
        auVar128 = vandps_avx(auVar185,local_29e0);
        auVar148 = vcmpps_avx(auVar128,auVar93,1);
        auVar163 = ZEXT3264(auVar148);
        auVar142 = vdivps_avx(auVar188,local_29e0);
        auVar128 = vandps_avx(auVar185,local_29c0);
        auVar180._8_4_ = 0x5d5e0b6b;
        auVar180._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar180._12_4_ = 0x5d5e0b6b;
        auVar180._16_4_ = 0x5d5e0b6b;
        auVar180._20_4_ = 0x5d5e0b6b;
        auVar180._24_4_ = 0x5d5e0b6b;
        auVar180._28_4_ = 0x5d5e0b6b;
        auVar183 = ZEXT3264(auVar180);
        _local_29a0 = vblendvps_avx(auVar149,auVar180,auVar94);
        auVar128 = vcmpps_avx(auVar128,auVar93,1);
        auVar94 = vdivps_avx(auVar188,local_29c0);
        _local_2980 = vblendvps_avx(auVar142,auVar180,auVar148);
        _local_2960 = vblendvps_avx(auVar94,auVar180,auVar128);
        auVar128 = vcmpps_avx(_local_29a0,ZEXT1632(auVar103),1);
        auVar142._8_4_ = 0x10;
        auVar142._0_8_ = 0x1000000010;
        auVar142._12_4_ = 0x10;
        auVar142._16_4_ = 0x10;
        auVar142._20_4_ = 0x10;
        auVar142._24_4_ = 0x10;
        auVar142._28_4_ = 0x10;
        local_2940 = vandps_avx(auVar128,auVar142);
        auVar94 = ZEXT1632(auVar103);
        auVar128 = vcmpps_avx(_local_2980,auVar94,5);
        auVar148._8_4_ = 0x20;
        auVar148._0_8_ = 0x2000000020;
        auVar148._12_4_ = 0x20;
        auVar148._16_4_ = 0x20;
        auVar148._20_4_ = 0x20;
        auVar148._24_4_ = 0x20;
        auVar148._28_4_ = 0x20;
        auVar143._8_4_ = 0x30;
        auVar143._0_8_ = 0x3000000030;
        auVar143._12_4_ = 0x30;
        auVar143._16_4_ = 0x30;
        auVar143._20_4_ = 0x30;
        auVar143._24_4_ = 0x30;
        auVar143._28_4_ = 0x30;
        local_2920 = vblendvps_avx(auVar143,auVar148,auVar128);
        auVar128 = vcmpps_avx(_local_2960,auVar94,5);
        auVar149._8_4_ = 0x40;
        auVar149._0_8_ = 0x4000000040;
        auVar149._12_4_ = 0x40;
        auVar149._16_4_ = 0x40;
        auVar149._20_4_ = 0x40;
        auVar149._24_4_ = 0x40;
        auVar149._28_4_ = 0x40;
        auVar144._8_4_ = 0x50;
        auVar144._0_8_ = 0x5000000050;
        auVar144._12_4_ = 0x50;
        auVar144._16_4_ = 0x50;
        auVar144._20_4_ = 0x50;
        auVar144._24_4_ = 0x50;
        auVar144._28_4_ = 0x50;
        auVar150 = ZEXT3264(auVar144);
        local_2900 = vblendvps_avx(auVar144,auVar149,auVar128);
        auVar128 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar94);
        local_2880 = vpmovsxwd_avx2(auVar17);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar187 = ZEXT3264(local_1e80);
        local_28e0 = vblendvps_avx(local_1e80,auVar128,local_2880);
        auVar128 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar94);
        auVar94._8_4_ = 0xff800000;
        auVar94._0_8_ = 0xff800000ff800000;
        auVar94._12_4_ = 0xff800000;
        auVar94._16_4_ = 0xff800000;
        auVar94._20_4_ = 0xff800000;
        auVar94._24_4_ = 0xff800000;
        auVar94._28_4_ = 0xff800000;
        local_28c0 = vblendvps_avx(auVar94,auVar128,local_2880);
        auVar103 = vpcmpeqd_avx(local_28c0._0_16_,local_28c0._0_16_);
        local_2cc0 = vpmovsxwd_avx2(auVar17 ^ auVar103);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar80 = 5;
        }
        else {
          pRVar76 = (RTCIntersectArguments *)
                    (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT);
          uVar80 = (long)pRVar76 * 3 + 2;
        }
        pRVar1 = ray + 0x100;
        puVar81 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar78 = (undefined1 (*) [32])local_1e40;
        local_2608 = (bvh->root).ptr;
        local_1e60 = local_28e0;
        local_28a0 = mm_lookupmask_ps._16_8_;
        uStack_2898 = mm_lookupmask_ps._24_8_;
        uStack_2890 = mm_lookupmask_ps._16_8_;
        uStack_2888 = mm_lookupmask_ps._24_8_;
        auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        auVar128 = vpcmpeqd_avx2(in_ZMM14._0_32_,in_ZMM14._0_32_);
        auVar193 = ZEXT3264(auVar128);
LAB_005c0ab5:
        pauVar78 = pauVar78 + -1;
        root.ptr = puVar81[-1];
        puVar81 = puVar81 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_005c1fc7;
        auVar128 = *pauVar78;
        auVar201 = ZEXT3264(auVar128);
        auVar94 = vcmpps_avx(auVar128,local_28c0,1);
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0x7f,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0xbf,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar94[0x1f]) {
LAB_005c1fd8:
          iVar72 = 2;
        }
        else {
          uVar74 = vmovmskps_avx(auVar94);
          pRVar76 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar76 >> 0x20),uVar74);
          iVar72 = 0;
          if ((uint)POPCOUNT(uVar74) <= uVar80) {
            if (pRVar76 != (RTCIntersectArguments *)0x0) {
              local_2da0 = auVar186._0_32_;
              local_2ca0 = auVar128;
              do {
                local_2dc0._0_8_ = pRVar76;
                k = 0;
                for (; ((ulong)pRVar76 & 1) == 0;
                    pRVar76 = (RTCIntersectArguments *)((ulong)pRVar76 >> 1 | 0x8000000000000000)) {
                  k = k + 1;
                }
                auVar150 = ZEXT1664(auVar150._0_16_);
                auVar163 = ZEXT1664(auVar163._0_16_);
                auVar183 = ZEXT1664(auVar183._0_16_);
                auVar128 = ZEXT1632(auVar193._0_16_);
                bVar83 = occluded1(This,bvh,root,k,&local_2e00,ray,
                                   (TravRayK<8,_true> *)&local_2a60.field_0,context);
                if (bVar83) {
                  *(undefined4 *)(local_2cc0 + k * 4) = 0xffffffff;
                }
                pRVar76 = (RTCIntersectArguments *)(local_2dc0._0_8_ - 1 & local_2dc0._0_8_);
                auVar186 = ZEXT3264(local_2da0);
                auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar128 = vpcmpeqd_avx2(auVar128,auVar128);
                auVar193 = ZEXT3264(auVar128);
                auVar201 = ZEXT3264(local_2ca0);
              } while (pRVar76 != (RTCIntersectArguments *)0x0);
            }
            auVar128 = auVar193._0_32_ & ~local_2cc0;
            iVar72 = 3;
            if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar128 >> 0x7f,0) != '\0') ||
                  (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0xbf,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar128[0x1f] < '\0') {
              auVar128._8_4_ = 0xff800000;
              auVar128._0_8_ = 0xff800000ff800000;
              auVar128._12_4_ = 0xff800000;
              auVar128._16_4_ = 0xff800000;
              auVar128._20_4_ = 0xff800000;
              auVar128._24_4_ = 0xff800000;
              auVar128._28_4_ = 0xff800000;
              local_28c0 = vblendvps_avx(local_28c0,auVar128,local_2cc0);
              iVar72 = 2;
            }
          }
          pGVar71 = local_2e00.super_Precalculations.grid;
          if ((uint)uVar80 < (uint)POPCOUNT(uVar74)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_005c1fc7;
                auVar128 = vcmpps_avx(local_28c0,auVar201._0_32_,6);
                if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar128 >> 0x7f,0) == '\0') &&
                      (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar128 >> 0xbf,0) == '\0') &&
                    (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar128[0x1f]) goto LAB_005c1fd8;
                if (((uint)root.ptr & 0xf) != 8) {
                  local_2e00.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0)
                  ;
                  pRVar76 = *(RTCIntersectArguments **)
                             (local_2e00.super_Precalculations.grid +
                             (ulong)*(uint *)(local_2e00.super_Precalculations.grid + 0x2c) + 0x30);
                  auVar97._8_8_ = uStack_2898;
                  auVar97._0_8_ = local_28a0;
                  auVar97._16_8_ = uStack_2890;
                  auVar97._24_8_ = uStack_2888;
                  goto LAB_005c1f6b;
                }
                auVar201 = ZEXT3264(CONCAT428(auVar193._28_4_ ^ local_2cc0._28_4_,
                                              CONCAT424(auVar193._24_4_ ^ local_2cc0._24_4_,
                                                        CONCAT420(auVar193._20_4_ ^
                                                                  local_2cc0._20_4_,
                                                                  CONCAT416(auVar193._16_4_ ^
                                                                            local_2cc0._16_4_,
                                                                            CONCAT412(auVar193.
                                                  _12_4_ ^ local_2cc0._12_4_,
                                                  CONCAT48(auVar193._8_4_ ^ local_2cc0._8_4_,
                                                           CONCAT44(auVar193._4_4_ ^
                                                                    local_2cc0._4_4_,
                                                                    auVar193._0_4_ ^
                                                                    local_2cc0._0_4_))))))));
                uVar73 = (ulong)*(uint *)(local_2e00.super_Precalculations.grid + 0x14);
                uVar75 = (ulong)*(uint *)(local_2e00.super_Precalculations.grid + 0xc);
                iVar72 = *(int *)(local_2e00.super_Precalculations.grid + 0x10);
                local_2d10 = (ulong)(uVar75 != 2) * 4 + 4;
                local_2d20 = uVar75 * 4;
                lVar77 = (ulong)*(uint *)(local_2e00.super_Precalculations.grid + 0x24) +
                         (root.ptr >> 4) * 4;
                lVar79 = uVar73 * 0xc + lVar77;
                local_2e60 = local_2e00.super_Precalculations.grid + lVar79 + uVar75 * 4 + 0x2c;
                lVar82 = lVar77 + uVar73 * 8;
                local_2ca0._0_8_ =
                     local_2e00.super_Precalculations.grid + lVar82 + uVar75 * 4 + 0x30;
                lVar3 = lVar77 + uVar73 * 4;
                local_2e50 = local_2e00.super_Precalculations.grid + lVar3 + uVar75 * 4 + 0x30;
                local_2e58 = local_2e00.super_Precalculations.grid + lVar77 + uVar75 * 4 + 0x30;
                local_2e68 = local_2e00.super_Precalculations.grid + lVar79 + 0x30;
                local_2e08 = local_2e00.super_Precalculations.grid + lVar82 + 0x30;
                local_2e10 = local_2e00.super_Precalculations.grid + lVar3 + 0x30;
                lVar77 = (ulong)*(uint *)(local_2e00.super_Precalculations.grid + 0x24) + 0x2c +
                         (root.ptr >> 4) * 4;
                local_2e18 = 0;
                local_2da0 = auVar186._0_32_;
                goto LAB_005c0dd1;
              }
              auVar201 = ZEXT3264(auVar187._0_32_);
              uVar73 = 8;
              uVar75 = 0;
              do {
                uVar7 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar75 * 8);
                if (uVar7 != 8) {
                  uVar74 = *(undefined4 *)(root.ptr + 0x20 + uVar75 * 4);
                  auVar84._4_4_ = uVar74;
                  auVar84._0_4_ = uVar74;
                  auVar84._8_4_ = uVar74;
                  auVar84._12_4_ = uVar74;
                  auVar84._16_4_ = uVar74;
                  auVar84._20_4_ = uVar74;
                  auVar84._24_4_ = uVar74;
                  auVar84._28_4_ = uVar74;
                  auVar67._8_8_ = local_2a60._8_8_;
                  auVar67._0_8_ = local_2a60._0_8_;
                  auVar67._16_8_ = local_2a60._16_8_;
                  auVar67._24_8_ = local_2a60._24_8_;
                  auVar68._8_8_ = local_2a60._40_8_;
                  auVar68._0_8_ = local_2a60._32_8_;
                  auVar68._16_8_ = local_2a60._48_8_;
                  auVar68._24_8_ = local_2a60._56_8_;
                  auVar69._8_8_ = local_2a60._72_8_;
                  auVar69._0_8_ = local_2a60._64_8_;
                  auVar69._16_8_ = local_2a60._80_8_;
                  auVar69._24_8_ = local_2a60._88_8_;
                  auVar128 = vsubps_avx(auVar84,auVar67);
                  auVar151._0_4_ = (float)local_29a0._0_4_ * auVar128._0_4_;
                  auVar151._4_4_ = (float)local_29a0._4_4_ * auVar128._4_4_;
                  auVar151._8_4_ = fStack_2998 * auVar128._8_4_;
                  auVar151._12_4_ = fStack_2994 * auVar128._12_4_;
                  auVar151._16_4_ = fStack_2990 * auVar128._16_4_;
                  auVar151._20_4_ = fStack_298c * auVar128._20_4_;
                  auVar151._28_36_ = auVar150._28_36_;
                  auVar151._24_4_ = fStack_2988 * auVar128._24_4_;
                  auVar148 = auVar151._0_32_;
                  auVar150 = ZEXT3264(auVar148);
                  uVar74 = *(undefined4 *)(root.ptr + 0x40 + uVar75 * 4);
                  auVar85._4_4_ = uVar74;
                  auVar85._0_4_ = uVar74;
                  auVar85._8_4_ = uVar74;
                  auVar85._12_4_ = uVar74;
                  auVar85._16_4_ = uVar74;
                  auVar85._20_4_ = uVar74;
                  auVar85._24_4_ = uVar74;
                  auVar85._28_4_ = uVar74;
                  auVar128 = vsubps_avx(auVar85,auVar68);
                  auVar164._0_4_ = (float)local_2980._0_4_ * auVar128._0_4_;
                  auVar164._4_4_ = (float)local_2980._4_4_ * auVar128._4_4_;
                  auVar164._8_4_ = fStack_2978 * auVar128._8_4_;
                  auVar164._12_4_ = fStack_2974 * auVar128._12_4_;
                  auVar164._16_4_ = fStack_2970 * auVar128._16_4_;
                  auVar164._20_4_ = fStack_296c * auVar128._20_4_;
                  auVar164._28_36_ = auVar163._28_36_;
                  auVar164._24_4_ = fStack_2968 * auVar128._24_4_;
                  auVar149 = auVar164._0_32_;
                  auVar163 = ZEXT3264(auVar149);
                  uVar74 = *(undefined4 *)(root.ptr + 0x60 + uVar75 * 4);
                  auVar86._4_4_ = uVar74;
                  auVar86._0_4_ = uVar74;
                  auVar86._8_4_ = uVar74;
                  auVar86._12_4_ = uVar74;
                  auVar86._16_4_ = uVar74;
                  auVar86._20_4_ = uVar74;
                  auVar86._24_4_ = uVar74;
                  auVar86._28_4_ = uVar74;
                  auVar128 = vsubps_avx(auVar86,auVar69);
                  auVar184._0_4_ = (float)local_2960._0_4_ * auVar128._0_4_;
                  auVar184._4_4_ = (float)local_2960._4_4_ * auVar128._4_4_;
                  auVar184._8_4_ = fStack_2958 * auVar128._8_4_;
                  auVar184._12_4_ = fStack_2954 * auVar128._12_4_;
                  auVar184._16_4_ = fStack_2950 * auVar128._16_4_;
                  auVar184._20_4_ = fStack_294c * auVar128._20_4_;
                  auVar184._28_36_ = auVar183._28_36_;
                  auVar184._24_4_ = fStack_2948 * auVar128._24_4_;
                  auVar142 = auVar184._0_32_;
                  auVar183 = ZEXT3264(auVar142);
                  uVar74 = *(undefined4 *)(root.ptr + 0x30 + uVar75 * 4);
                  auVar87._4_4_ = uVar74;
                  auVar87._0_4_ = uVar74;
                  auVar87._8_4_ = uVar74;
                  auVar87._12_4_ = uVar74;
                  auVar87._16_4_ = uVar74;
                  auVar87._20_4_ = uVar74;
                  auVar87._24_4_ = uVar74;
                  auVar87._28_4_ = uVar74;
                  auVar128 = vsubps_avx(auVar87,auVar67);
                  auVar19._4_4_ = (float)local_29a0._4_4_ * auVar128._4_4_;
                  auVar19._0_4_ = (float)local_29a0._0_4_ * auVar128._0_4_;
                  auVar19._8_4_ = fStack_2998 * auVar128._8_4_;
                  auVar19._12_4_ = fStack_2994 * auVar128._12_4_;
                  auVar19._16_4_ = fStack_2990 * auVar128._16_4_;
                  auVar19._20_4_ = fStack_298c * auVar128._20_4_;
                  auVar19._24_4_ = fStack_2988 * auVar128._24_4_;
                  auVar19._28_4_ = (int)((ulong)local_2a60._24_8_ >> 0x20);
                  uVar74 = *(undefined4 *)(root.ptr + 0x50 + uVar75 * 4);
                  auVar88._4_4_ = uVar74;
                  auVar88._0_4_ = uVar74;
                  auVar88._8_4_ = uVar74;
                  auVar88._12_4_ = uVar74;
                  auVar88._16_4_ = uVar74;
                  auVar88._20_4_ = uVar74;
                  auVar88._24_4_ = uVar74;
                  auVar88._28_4_ = uVar74;
                  auVar128 = vsubps_avx(auVar88,auVar68);
                  auVar20._4_4_ = (float)local_2980._4_4_ * auVar128._4_4_;
                  auVar20._0_4_ = (float)local_2980._0_4_ * auVar128._0_4_;
                  auVar20._8_4_ = fStack_2978 * auVar128._8_4_;
                  auVar20._12_4_ = fStack_2974 * auVar128._12_4_;
                  auVar20._16_4_ = fStack_2970 * auVar128._16_4_;
                  auVar20._20_4_ = fStack_296c * auVar128._20_4_;
                  auVar20._24_4_ = fStack_2968 * auVar128._24_4_;
                  auVar20._28_4_ = (int)((ulong)local_2a60._56_8_ >> 0x20);
                  uVar74 = *(undefined4 *)(root.ptr + 0x70 + uVar75 * 4);
                  auVar89._4_4_ = uVar74;
                  auVar89._0_4_ = uVar74;
                  auVar89._8_4_ = uVar74;
                  auVar89._12_4_ = uVar74;
                  auVar89._16_4_ = uVar74;
                  auVar89._20_4_ = uVar74;
                  auVar89._24_4_ = uVar74;
                  auVar89._28_4_ = uVar74;
                  auVar128 = vsubps_avx(auVar89,auVar69);
                  auVar21._4_4_ = (float)local_2960._4_4_ * auVar128._4_4_;
                  auVar21._0_4_ = (float)local_2960._0_4_ * auVar128._0_4_;
                  auVar21._8_4_ = fStack_2958 * auVar128._8_4_;
                  auVar21._12_4_ = fStack_2954 * auVar128._12_4_;
                  auVar21._16_4_ = fStack_2950 * auVar128._16_4_;
                  auVar21._20_4_ = fStack_294c * auVar128._20_4_;
                  auVar21._24_4_ = fStack_2948 * auVar128._24_4_;
                  auVar21._28_4_ = (int)((ulong)local_2a60._88_8_ >> 0x20);
                  auVar128 = vminps_avx(auVar148,auVar19);
                  auVar94 = vminps_avx(auVar149,auVar20);
                  auVar128 = vmaxps_avx(auVar128,auVar94);
                  auVar94 = vminps_avx(auVar142,auVar21);
                  auVar128 = vmaxps_avx(auVar128,auVar94);
                  auVar22._4_4_ = auVar128._4_4_ * 0.99999964;
                  auVar22._0_4_ = auVar128._0_4_ * 0.99999964;
                  auVar22._8_4_ = auVar128._8_4_ * 0.99999964;
                  auVar22._12_4_ = auVar128._12_4_ * 0.99999964;
                  auVar22._16_4_ = auVar128._16_4_ * 0.99999964;
                  auVar22._20_4_ = auVar128._20_4_ * 0.99999964;
                  auVar22._24_4_ = auVar128._24_4_ * 0.99999964;
                  auVar22._28_4_ = auVar128._28_4_;
                  auVar128 = vmaxps_avx(auVar148,auVar19);
                  auVar94 = vmaxps_avx(auVar149,auVar20);
                  auVar94 = vminps_avx(auVar128,auVar94);
                  auVar128 = vmaxps_avx(auVar142,auVar21);
                  auVar128 = vminps_avx(auVar94,auVar128);
                  auVar23._4_4_ = auVar190._4_4_ * auVar128._4_4_;
                  auVar23._0_4_ = auVar190._0_4_ * auVar128._0_4_;
                  auVar23._8_4_ = auVar190._8_4_ * auVar128._8_4_;
                  auVar23._12_4_ = auVar190._12_4_ * auVar128._12_4_;
                  auVar23._16_4_ = auVar190._16_4_ * auVar128._16_4_;
                  auVar23._20_4_ = auVar190._20_4_ * auVar128._20_4_;
                  auVar23._24_4_ = auVar190._24_4_ * auVar128._24_4_;
                  auVar23._28_4_ = auVar128._28_4_;
                  auVar128 = vmaxps_avx(auVar22,local_28e0);
                  auVar94 = vminps_avx(auVar23,local_28c0);
                  auVar128 = vcmpps_avx(auVar128,auVar94,2);
                  if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar128 >> 0x7f,0) != '\0') ||
                        (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar128 >> 0xbf,0) != '\0') ||
                      (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar128[0x1f] < '\0') {
                    auVar128 = vblendvps_avx(auVar187._0_32_,auVar22,auVar128);
                    if (uVar73 != 8) {
                      *puVar81 = uVar73;
                      puVar81 = puVar81 + 1;
                      *pauVar78 = auVar201._0_32_;
                      pauVar78 = pauVar78 + 1;
                    }
                    auVar201 = ZEXT3264(auVar128);
                    uVar73 = uVar7;
                  }
                }
              } while ((uVar7 != 8) && (bVar83 = uVar75 < 3, uVar75 = uVar75 + 1, bVar83));
              iVar72 = 0;
              if (uVar73 == 8) {
LAB_005c0c8a:
                pRVar76 = (RTCIntersectArguments *)0x0;
                iVar72 = 4;
              }
              else {
                auVar128 = vcmpps_avx(local_28c0,auVar201._0_32_,6);
                uVar74 = vmovmskps_avx(auVar128);
                pRVar76 = (RTCIntersectArguments *)
                          CONCAT71((int7)(CONCAT44((int)((root.ptr & 0xfffffffffffffff0) >> 0x20),
                                                   uVar74) >> 8),1);
                if ((uint)POPCOUNT(uVar74) <= (uint)uVar80) {
                  *puVar81 = uVar73;
                  puVar81 = puVar81 + 1;
                  *pauVar78 = auVar201._0_32_;
                  pauVar78 = pauVar78 + 1;
                  goto LAB_005c0c8a;
                }
              }
              root.ptr = uVar73;
            } while ((char)pRVar76 != '\0');
          }
        }
        goto LAB_005c1fca;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    local_2e60 = local_2e60 + local_2d20;
    local_2ca0._0_8_ = local_2ca0._0_8_ + local_2d20;
    local_2e50 = local_2e50 + local_2d20;
    local_2e58 = local_2e58 + local_2d20;
    local_2e68 = local_2e68 + local_2d20;
    local_2e08 = local_2e08 + local_2d20;
    local_2e10 = local_2e10 + local_2d20;
    lVar77 = local_2d18 + local_2d20;
    bVar83 = local_2e18 != 0;
    local_2e18 = local_2e18 + 1;
    if (bVar83) break;
LAB_005c0dd1:
    local_2d08 = pGVar71 + lVar77;
    lVar82 = 0;
    local_2d18 = lVar77;
    do {
      if (local_2d10 == lVar82) break;
      uVar74 = *(undefined4 *)(local_2d08 + lVar82);
      auVar90._4_4_ = uVar74;
      auVar90._0_4_ = uVar74;
      auVar90._8_4_ = uVar74;
      auVar90._12_4_ = uVar74;
      auVar90._16_4_ = uVar74;
      auVar90._20_4_ = uVar74;
      auVar90._24_4_ = uVar74;
      auVar90._28_4_ = uVar74;
      auVar149 = auVar201._0_32_;
      uVar74 = *(undefined4 *)(local_2e10 + lVar82 + -4);
      auVar104._4_4_ = uVar74;
      auVar104._0_4_ = uVar74;
      auVar104._8_4_ = uVar74;
      auVar104._12_4_ = uVar74;
      auVar104._16_4_ = uVar74;
      auVar104._20_4_ = uVar74;
      auVar104._24_4_ = uVar74;
      auVar104._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(local_2e08 + lVar82 + -4);
      auVar118._4_4_ = uVar74;
      auVar118._0_4_ = uVar74;
      auVar118._8_4_ = uVar74;
      auVar118._12_4_ = uVar74;
      auVar118._16_4_ = uVar74;
      auVar118._20_4_ = uVar74;
      auVar118._24_4_ = uVar74;
      auVar118._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(local_2e58 + lVar82 + -4);
      local_2c60._4_4_ = uVar74;
      local_2c60._0_4_ = uVar74;
      fStack_2c58 = (float)uVar74;
      fStack_2c54 = (float)uVar74;
      fStack_2c50 = (float)uVar74;
      fStack_2c4c = (float)uVar74;
      fStack_2c48 = (float)uVar74;
      uStack_2c44 = uVar74;
      uVar74 = *(undefined4 *)(local_2e50 + lVar82 + -4);
      local_2c80._4_4_ = uVar74;
      local_2c80._0_4_ = uVar74;
      local_2c80._8_4_ = uVar74;
      local_2c80._12_4_ = uVar74;
      local_2c80._16_4_ = uVar74;
      local_2c80._20_4_ = uVar74;
      local_2c80._24_4_ = uVar74;
      local_2c80._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(local_2ca0._0_8_ + -4 + lVar82);
      local_2640._4_4_ = uVar74;
      local_2640._0_4_ = uVar74;
      local_2640._8_4_ = uVar74;
      local_2640._12_4_ = uVar74;
      local_2640._16_4_ = uVar74;
      local_2640._20_4_ = uVar74;
      local_2640._24_4_ = uVar74;
      local_2640._28_4_ = uVar74;
      auVar128 = *(undefined1 (*) [32])ray;
      auVar94 = *(undefined1 (*) [32])(ray + 0x20);
      auVar148 = *(undefined1 (*) [32])(ray + 0x40);
      auVar143 = vsubps_avx(auVar90,auVar128);
      local_2ce0 = vsubps_avx(auVar104,auVar94);
      local_2d00 = vsubps_avx(auVar118,auVar148);
      auVar142 = vsubps_avx(local_2c80,auVar94);
      auVar144 = vsubps_avx(local_2640,auVar148);
      local_2ba0 = vsubps_avx(auVar142,local_2ce0);
      auVar180 = vsubps_avx(auVar144,local_2d00);
      auVar129._0_4_ = auVar142._0_4_ + local_2ce0._0_4_;
      auVar129._4_4_ = auVar142._4_4_ + local_2ce0._4_4_;
      auVar129._8_4_ = auVar142._8_4_ + local_2ce0._8_4_;
      auVar129._12_4_ = auVar142._12_4_ + local_2ce0._12_4_;
      auVar129._16_4_ = auVar142._16_4_ + local_2ce0._16_4_;
      auVar129._20_4_ = auVar142._20_4_ + local_2ce0._20_4_;
      auVar129._24_4_ = auVar142._24_4_ + local_2ce0._24_4_;
      auVar129._28_4_ = auVar142._28_4_ + local_2ce0._28_4_;
      fVar102 = local_2d00._0_4_;
      auVar166._0_4_ = auVar144._0_4_ + fVar102;
      fVar110 = local_2d00._4_4_;
      auVar166._4_4_ = auVar144._4_4_ + fVar110;
      fVar112 = local_2d00._8_4_;
      auVar166._8_4_ = auVar144._8_4_ + fVar112;
      fVar114 = local_2d00._12_4_;
      auVar166._12_4_ = auVar144._12_4_ + fVar114;
      fVar10 = local_2d00._16_4_;
      auVar166._16_4_ = auVar144._16_4_ + fVar10;
      fVar11 = local_2d00._20_4_;
      auVar166._20_4_ = auVar144._20_4_ + fVar11;
      fVar12 = local_2d00._24_4_;
      auVar166._24_4_ = auVar144._24_4_ + fVar12;
      fVar152 = auVar144._28_4_;
      auVar166._28_4_ = fVar152 + local_2d00._28_4_;
      auVar163._0_4_ = auVar129._0_4_ * auVar180._0_4_;
      auVar163._4_4_ = auVar129._4_4_ * auVar180._4_4_;
      auVar163._8_4_ = auVar129._8_4_ * auVar180._8_4_;
      auVar163._12_4_ = auVar129._12_4_ * auVar180._12_4_;
      auVar163._16_4_ = auVar129._16_4_ * auVar180._16_4_;
      auVar163._20_4_ = auVar129._20_4_ * auVar180._20_4_;
      auVar163._28_36_ = auVar190._28_36_;
      auVar163._24_4_ = auVar129._24_4_ * auVar180._24_4_;
      auVar17 = vfmsub231ps_fma(auVar163._0_32_,local_2ba0,auVar166);
      auVar185 = vsubps_avx(_local_2c60,auVar128);
      local_2bc0 = vsubps_avx(auVar185,auVar143);
      auVar150._0_4_ = auVar166._0_4_ * local_2bc0._0_4_;
      auVar150._4_4_ = auVar166._4_4_ * local_2bc0._4_4_;
      auVar150._8_4_ = auVar166._8_4_ * local_2bc0._8_4_;
      auVar150._12_4_ = auVar166._12_4_ * local_2bc0._12_4_;
      auVar150._16_4_ = auVar166._16_4_ * local_2bc0._16_4_;
      auVar150._20_4_ = auVar166._20_4_ * local_2bc0._20_4_;
      auVar150._28_36_ = auVar186._28_36_;
      auVar150._24_4_ = auVar166._24_4_ * local_2bc0._24_4_;
      auVar167._0_4_ = auVar185._0_4_ + auVar143._0_4_;
      auVar167._4_4_ = auVar185._4_4_ + auVar143._4_4_;
      auVar167._8_4_ = auVar185._8_4_ + auVar143._8_4_;
      auVar167._12_4_ = auVar185._12_4_ + auVar143._12_4_;
      auVar167._16_4_ = auVar185._16_4_ + auVar143._16_4_;
      auVar167._20_4_ = auVar185._20_4_ + auVar143._20_4_;
      auVar167._24_4_ = auVar185._24_4_ + auVar143._24_4_;
      auVar167._28_4_ = auVar185._28_4_ + auVar143._28_4_;
      auVar103 = vfmsub231ps_fma(auVar150._0_32_,auVar180,auVar167);
      auVar18._4_4_ = auVar167._4_4_ * local_2ba0._4_4_;
      auVar18._0_4_ = auVar167._0_4_ * local_2ba0._0_4_;
      auVar18._8_4_ = auVar167._8_4_ * local_2ba0._8_4_;
      auVar18._12_4_ = auVar167._12_4_ * local_2ba0._12_4_;
      auVar18._16_4_ = auVar167._16_4_ * local_2ba0._16_4_;
      auVar18._20_4_ = auVar167._20_4_ * local_2ba0._20_4_;
      auVar18._24_4_ = auVar167._24_4_ * local_2ba0._24_4_;
      auVar18._28_4_ = auVar167._28_4_;
      auVar140 = vfmsub231ps_fma(auVar18,local_2bc0,auVar129);
      pRVar2 = ray + 0xc0;
      fVar109 = *(float *)pRVar2;
      fVar111 = *(float *)(ray + 0xc4);
      fVar113 = *(float *)(ray + 200);
      fVar115 = *(float *)(ray + 0xcc);
      fVar116 = *(float *)(ray + 0xd0);
      fVar117 = *(float *)(ray + 0xd4);
      fVar66 = *(float *)(ray + 0xd8);
      auVar70 = *(undefined1 (*) [28])pRVar2;
      auVar90 = *(undefined1 (*) [32])pRVar2;
      auVar133._4_4_ = auVar140._4_4_ * fVar111;
      auVar133._0_4_ = auVar140._0_4_ * fVar109;
      auVar133._8_4_ = auVar140._8_4_ * fVar113;
      auVar133._12_4_ = auVar140._12_4_ * fVar115;
      auVar133._16_4_ = fVar116 * 0.0;
      auVar133._20_4_ = fVar117 * 0.0;
      auVar133._24_4_ = fVar66 * 0.0;
      auVar133._28_4_ = auVar129._28_4_;
      local_2d80 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar103 = vfmadd231ps_fma(auVar133,local_2d80,ZEXT1632(auVar103));
      local_2c00 = *(undefined1 (*) [32])(ray + 0x80);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_2c00,ZEXT1632(auVar17));
      uVar74 = *(undefined4 *)(local_2d08 + lVar82 + 4);
      local_2660._4_4_ = uVar74;
      local_2660._0_4_ = uVar74;
      local_2660._8_4_ = uVar74;
      local_2660._12_4_ = uVar74;
      local_2660._16_4_ = uVar74;
      local_2660._20_4_ = uVar74;
      local_2660._24_4_ = uVar74;
      local_2660._28_4_ = uVar74;
      auVar128 = vsubps_avx(local_2660,auVar128);
      uVar74 = *(undefined4 *)(local_2e10 + lVar82);
      local_2680._4_4_ = uVar74;
      local_2680._0_4_ = uVar74;
      local_2680._8_4_ = uVar74;
      local_2680._12_4_ = uVar74;
      local_2680._16_4_ = uVar74;
      local_2680._20_4_ = uVar74;
      local_2680._24_4_ = uVar74;
      local_2680._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(local_2e08 + lVar82);
      local_26a0._4_4_ = uVar74;
      local_26a0._0_4_ = uVar74;
      local_26a0._8_4_ = uVar74;
      local_26a0._12_4_ = uVar74;
      local_26a0._16_4_ = uVar74;
      local_26a0._20_4_ = uVar74;
      local_26a0._24_4_ = uVar74;
      local_26a0._28_4_ = uVar74;
      auVar94 = vsubps_avx(local_2680,auVar94);
      auVar148 = vsubps_avx(local_26a0,auVar148);
      auVar93 = vsubps_avx(local_2ce0,auVar94);
      auVar188 = vsubps_avx(local_2d00,auVar148);
      auVar160._0_4_ = local_2ce0._0_4_ + auVar94._0_4_;
      auVar160._4_4_ = local_2ce0._4_4_ + auVar94._4_4_;
      auVar160._8_4_ = local_2ce0._8_4_ + auVar94._8_4_;
      auVar160._12_4_ = local_2ce0._12_4_ + auVar94._12_4_;
      auVar160._16_4_ = local_2ce0._16_4_ + auVar94._16_4_;
      auVar160._20_4_ = local_2ce0._20_4_ + auVar94._20_4_;
      auVar160._24_4_ = local_2ce0._24_4_ + auVar94._24_4_;
      auVar160._28_4_ = local_2ce0._28_4_ + auVar94._28_4_;
      auVar189._0_4_ = fVar102 + auVar148._0_4_;
      auVar189._4_4_ = fVar110 + auVar148._4_4_;
      auVar189._8_4_ = fVar112 + auVar148._8_4_;
      auVar189._12_4_ = fVar114 + auVar148._12_4_;
      auVar189._16_4_ = fVar10 + auVar148._16_4_;
      auVar189._20_4_ = fVar11 + auVar148._20_4_;
      auVar189._24_4_ = fVar12 + auVar148._24_4_;
      fVar101 = auVar148._28_4_;
      auVar189._28_4_ = local_2d00._28_4_ + fVar101;
      fVar191 = auVar188._0_4_;
      fVar194 = auVar188._4_4_;
      auVar146._4_4_ = fVar194 * auVar160._4_4_;
      auVar146._0_4_ = fVar191 * auVar160._0_4_;
      fVar195 = auVar188._8_4_;
      auVar146._8_4_ = fVar195 * auVar160._8_4_;
      fVar196 = auVar188._12_4_;
      auVar146._12_4_ = fVar196 * auVar160._12_4_;
      fVar197 = auVar188._16_4_;
      auVar146._16_4_ = fVar197 * auVar160._16_4_;
      fVar198 = auVar188._20_4_;
      auVar146._20_4_ = fVar198 * auVar160._20_4_;
      fVar199 = auVar188._24_4_;
      auVar146._24_4_ = fVar199 * auVar160._24_4_;
      auVar146._28_4_ = fVar152;
      auVar140 = vfmsub231ps_fma(auVar146,auVar93,auVar189);
      auVar18 = vsubps_avx(auVar143,auVar128);
      fVar98 = auVar18._0_4_;
      fVar99 = auVar18._4_4_;
      auVar130._4_4_ = auVar189._4_4_ * fVar99;
      auVar130._0_4_ = auVar189._0_4_ * fVar98;
      fVar100 = auVar18._8_4_;
      auVar130._8_4_ = auVar189._8_4_ * fVar100;
      fVar13 = auVar18._12_4_;
      auVar130._12_4_ = auVar189._12_4_ * fVar13;
      fVar14 = auVar18._16_4_;
      auVar130._16_4_ = auVar189._16_4_ * fVar14;
      fVar15 = auVar18._20_4_;
      auVar130._20_4_ = auVar189._20_4_ * fVar15;
      fVar16 = auVar18._24_4_;
      auVar130._24_4_ = auVar189._24_4_ * fVar16;
      auVar130._28_4_ = auVar189._28_4_;
      auVar153._0_4_ = auVar143._0_4_ + auVar128._0_4_;
      auVar153._4_4_ = auVar143._4_4_ + auVar128._4_4_;
      auVar153._8_4_ = auVar143._8_4_ + auVar128._8_4_;
      auVar153._12_4_ = auVar143._12_4_ + auVar128._12_4_;
      auVar153._16_4_ = auVar143._16_4_ + auVar128._16_4_;
      auVar153._20_4_ = auVar143._20_4_ + auVar128._20_4_;
      auVar153._24_4_ = auVar143._24_4_ + auVar128._24_4_;
      auVar153._28_4_ = auVar143._28_4_ + auVar128._28_4_;
      auVar17 = vfmsub231ps_fma(auVar130,auVar188,auVar153);
      fVar165 = auVar93._0_4_;
      fVar172 = auVar93._4_4_;
      auVar154._4_4_ = fVar172 * auVar153._4_4_;
      auVar154._0_4_ = fVar165 * auVar153._0_4_;
      fVar173 = auVar93._8_4_;
      auVar154._8_4_ = fVar173 * auVar153._8_4_;
      fVar174 = auVar93._12_4_;
      auVar154._12_4_ = fVar174 * auVar153._12_4_;
      fVar175 = auVar93._16_4_;
      auVar154._16_4_ = fVar175 * auVar153._16_4_;
      fVar176 = auVar93._20_4_;
      auVar154._20_4_ = fVar176 * auVar153._20_4_;
      fVar177 = auVar93._24_4_;
      auVar154._24_4_ = fVar177 * auVar153._24_4_;
      auVar154._28_4_ = auVar153._28_4_;
      auVar178 = vfmsub231ps_fma(auVar154,auVar18,auVar160);
      auVar24._4_4_ = fVar111 * auVar178._4_4_;
      auVar24._0_4_ = fVar109 * auVar178._0_4_;
      auVar24._8_4_ = fVar113 * auVar178._8_4_;
      auVar24._12_4_ = fVar115 * auVar178._12_4_;
      auVar24._16_4_ = fVar116 * 0.0;
      auVar24._20_4_ = fVar117 * 0.0;
      auVar24._24_4_ = fVar66 * 0.0;
      auVar24._28_4_ = auVar160._28_4_;
      auVar17 = vfmadd231ps_fma(auVar24,local_2d80,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_2c00,ZEXT1632(auVar140));
      auVar163 = ZEXT1664(auVar17);
      auVar133 = vsubps_avx(auVar128,auVar185);
      auVar91._0_4_ = auVar185._0_4_ + auVar128._0_4_;
      auVar91._4_4_ = auVar185._4_4_ + auVar128._4_4_;
      auVar91._8_4_ = auVar185._8_4_ + auVar128._8_4_;
      auVar91._12_4_ = auVar185._12_4_ + auVar128._12_4_;
      auVar91._16_4_ = auVar185._16_4_ + auVar128._16_4_;
      auVar91._20_4_ = auVar185._20_4_ + auVar128._20_4_;
      auVar91._24_4_ = auVar185._24_4_ + auVar128._24_4_;
      auVar91._28_4_ = auVar185._28_4_ + auVar128._28_4_;
      auVar185 = vsubps_avx(auVar94,auVar142);
      auVar105._0_4_ = auVar142._0_4_ + auVar94._0_4_;
      auVar105._4_4_ = auVar142._4_4_ + auVar94._4_4_;
      auVar105._8_4_ = auVar142._8_4_ + auVar94._8_4_;
      auVar105._12_4_ = auVar142._12_4_ + auVar94._12_4_;
      auVar105._16_4_ = auVar142._16_4_ + auVar94._16_4_;
      auVar105._20_4_ = auVar142._20_4_ + auVar94._20_4_;
      auVar105._24_4_ = auVar142._24_4_ + auVar94._24_4_;
      auVar105._28_4_ = auVar142._28_4_ + auVar94._28_4_;
      auVar146 = vsubps_avx(auVar148,auVar144);
      auVar183 = ZEXT3264(auVar146);
      auVar119._0_4_ = auVar148._0_4_ + auVar144._0_4_;
      auVar119._4_4_ = auVar148._4_4_ + auVar144._4_4_;
      auVar119._8_4_ = auVar148._8_4_ + auVar144._8_4_;
      auVar119._12_4_ = auVar148._12_4_ + auVar144._12_4_;
      auVar119._16_4_ = auVar148._16_4_ + auVar144._16_4_;
      auVar119._20_4_ = auVar148._20_4_ + auVar144._20_4_;
      auVar119._24_4_ = auVar148._24_4_ + auVar144._24_4_;
      auVar119._28_4_ = fVar101 + fVar152;
      auVar25._4_4_ = auVar146._4_4_ * auVar105._4_4_;
      auVar25._0_4_ = auVar146._0_4_ * auVar105._0_4_;
      auVar25._8_4_ = auVar146._8_4_ * auVar105._8_4_;
      auVar25._12_4_ = auVar146._12_4_ * auVar105._12_4_;
      auVar25._16_4_ = auVar146._16_4_ * auVar105._16_4_;
      auVar25._20_4_ = auVar146._20_4_ * auVar105._20_4_;
      auVar25._24_4_ = auVar146._24_4_ * auVar105._24_4_;
      auVar25._28_4_ = fVar101;
      auVar178 = vfmsub231ps_fma(auVar25,auVar185,auVar119);
      auVar26._4_4_ = auVar133._4_4_ * auVar119._4_4_;
      auVar26._0_4_ = auVar133._0_4_ * auVar119._0_4_;
      auVar26._8_4_ = auVar133._8_4_ * auVar119._8_4_;
      auVar26._12_4_ = auVar133._12_4_ * auVar119._12_4_;
      auVar26._16_4_ = auVar133._16_4_ * auVar119._16_4_;
      auVar26._20_4_ = auVar133._20_4_ * auVar119._20_4_;
      auVar26._24_4_ = auVar133._24_4_ * auVar119._24_4_;
      auVar26._28_4_ = auVar119._28_4_;
      auVar140 = vfmsub231ps_fma(auVar26,auVar146,auVar91);
      auVar27._4_4_ = auVar185._4_4_ * auVar91._4_4_;
      auVar27._0_4_ = auVar185._0_4_ * auVar91._0_4_;
      auVar27._8_4_ = auVar185._8_4_ * auVar91._8_4_;
      auVar27._12_4_ = auVar185._12_4_ * auVar91._12_4_;
      auVar27._16_4_ = auVar185._16_4_ * auVar91._16_4_;
      auVar27._20_4_ = auVar185._20_4_ * auVar91._20_4_;
      auVar27._24_4_ = auVar185._24_4_ * auVar91._24_4_;
      auVar27._28_4_ = auVar91._28_4_;
      auVar141 = vfmsub231ps_fma(auVar27,auVar133,auVar105);
      auVar92._0_4_ = fVar109 * auVar141._0_4_;
      auVar92._4_4_ = fVar111 * auVar141._4_4_;
      auVar92._8_4_ = fVar113 * auVar141._8_4_;
      auVar92._12_4_ = fVar115 * auVar141._12_4_;
      auVar92._16_4_ = fVar116 * 0.0;
      auVar92._20_4_ = fVar117 * 0.0;
      auVar92._24_4_ = fVar66 * 0.0;
      auVar92._28_4_ = 0;
      auVar140 = vfmadd231ps_fma(auVar92,local_2d80,ZEXT1632(auVar140));
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_2c00,ZEXT1632(auVar178));
      auVar154 = ZEXT1632(CONCAT412(auVar140._12_4_ + auVar103._12_4_ + auVar17._12_4_,
                                    CONCAT48(auVar140._8_4_ + auVar103._8_4_ + auVar17._8_4_,
                                             CONCAT44(auVar140._4_4_ +
                                                      auVar103._4_4_ + auVar17._4_4_,
                                                      auVar140._0_4_ +
                                                      auVar103._0_4_ + auVar17._0_4_))));
      auVar186 = ZEXT3264(local_2da0);
      auVar128 = vandps_avx(auVar154,local_2da0);
      fVar101 = auVar128._0_4_ * 1.1920929e-07;
      fVar109 = auVar128._4_4_ * 1.1920929e-07;
      auVar28._4_4_ = fVar109;
      auVar28._0_4_ = fVar101;
      fVar111 = auVar128._8_4_ * 1.1920929e-07;
      auVar28._8_4_ = fVar111;
      fVar113 = auVar128._12_4_ * 1.1920929e-07;
      auVar28._12_4_ = fVar113;
      fVar115 = auVar128._16_4_ * 1.1920929e-07;
      auVar28._16_4_ = fVar115;
      fVar116 = auVar128._20_4_ * 1.1920929e-07;
      auVar28._20_4_ = fVar116;
      fVar117 = auVar128._24_4_ * 1.1920929e-07;
      auVar28._24_4_ = fVar117;
      auVar28._28_4_ = auVar128._28_4_;
      auVar130 = ZEXT1632(auVar103);
      auVar94 = vminps_avx(auVar130,ZEXT1632(auVar17));
      auVar94 = vminps_avx(auVar94,ZEXT1632(auVar140));
      auVar150 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar136._0_8_ = CONCAT44(fVar109,fVar101) ^ 0x8000000080000000;
      auVar136._8_4_ = -fVar111;
      auVar136._12_4_ = -fVar113;
      auVar136._16_4_ = -fVar115;
      auVar136._20_4_ = -fVar116;
      auVar136._24_4_ = -fVar117;
      auVar136._28_4_ = auVar128._28_4_ ^ 0x80000000;
      auVar148 = vcmpps_avx(auVar94,auVar136,5);
      auVar142 = vmaxps_avx(auVar130,ZEXT1632(auVar17));
      auVar128 = vmaxps_avx(auVar142,ZEXT1632(auVar140));
      auVar128 = vcmpps_avx(auVar128,auVar28,2);
      auVar128 = vorps_avx(auVar148,auVar128);
      auVar144 = auVar149 & auVar128;
      auVar128 = vandps_avx(auVar128,auVar149);
      auVar94 = auVar128;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        auVar29._4_4_ = fVar172 * auVar180._4_4_;
        auVar29._0_4_ = fVar165 * auVar180._0_4_;
        auVar29._8_4_ = fVar173 * auVar180._8_4_;
        auVar29._12_4_ = fVar174 * auVar180._12_4_;
        auVar29._16_4_ = fVar175 * auVar180._16_4_;
        auVar29._20_4_ = fVar176 * auVar180._20_4_;
        auVar29._24_4_ = fVar177 * auVar180._24_4_;
        auVar29._28_4_ = auVar128._28_4_;
        auVar30._4_4_ = fVar99 * local_2ba0._4_4_;
        auVar30._0_4_ = fVar98 * local_2ba0._0_4_;
        auVar30._8_4_ = fVar100 * local_2ba0._8_4_;
        auVar30._12_4_ = fVar13 * local_2ba0._12_4_;
        auVar30._16_4_ = fVar14 * local_2ba0._16_4_;
        auVar30._20_4_ = fVar15 * local_2ba0._20_4_;
        auVar30._24_4_ = fVar16 * local_2ba0._24_4_;
        auVar30._28_4_ = auVar201._28_4_;
        auVar103 = vfmsub213ps_fma(local_2ba0,auVar188,auVar29);
        auVar31._4_4_ = auVar185._4_4_ * fVar194;
        auVar31._0_4_ = auVar185._0_4_ * fVar191;
        auVar31._8_4_ = auVar185._8_4_ * fVar195;
        auVar31._12_4_ = auVar185._12_4_ * fVar196;
        auVar31._16_4_ = auVar185._16_4_ * fVar197;
        auVar31._20_4_ = auVar185._20_4_ * fVar198;
        auVar31._24_4_ = auVar185._24_4_ * fVar199;
        auVar31._28_4_ = auVar148._28_4_;
        auVar32._4_4_ = fVar99 * auVar146._4_4_;
        auVar32._0_4_ = fVar98 * auVar146._0_4_;
        auVar32._8_4_ = fVar100 * auVar146._8_4_;
        auVar32._12_4_ = fVar13 * auVar146._12_4_;
        auVar32._16_4_ = fVar14 * auVar146._16_4_;
        auVar32._20_4_ = fVar15 * auVar146._20_4_;
        auVar32._24_4_ = fVar16 * auVar146._24_4_;
        auVar32._28_4_ = auVar142._28_4_;
        auVar140 = vfmsub213ps_fma(auVar146,auVar93,auVar31);
        auVar94 = vandps_avx(local_2da0,auVar29);
        auVar148 = vandps_avx(local_2da0,auVar31);
        auVar94 = vcmpps_avx(auVar94,auVar148,1);
        auVar142 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar103),auVar94);
        auVar33._4_4_ = auVar133._4_4_ * fVar172;
        auVar33._0_4_ = auVar133._0_4_ * fVar165;
        auVar33._8_4_ = auVar133._8_4_ * fVar173;
        auVar33._12_4_ = auVar133._12_4_ * fVar174;
        auVar33._16_4_ = auVar133._16_4_ * fVar175;
        auVar33._20_4_ = auVar133._20_4_ * fVar176;
        auVar33._24_4_ = auVar133._24_4_ * fVar177;
        auVar33._28_4_ = auVar94._28_4_;
        auVar103 = vfmsub213ps_fma(auVar133,auVar188,auVar32);
        auVar145._0_4_ = local_2bc0._0_4_ * fVar191;
        auVar145._4_4_ = local_2bc0._4_4_ * fVar194;
        auVar145._8_4_ = local_2bc0._8_4_ * fVar195;
        auVar145._12_4_ = local_2bc0._12_4_ * fVar196;
        auVar145._16_4_ = local_2bc0._16_4_ * fVar197;
        auVar145._20_4_ = local_2bc0._20_4_ * fVar198;
        auVar145._24_4_ = local_2bc0._24_4_ * fVar199;
        auVar145._28_4_ = 0;
        auVar140 = vfmsub213ps_fma(auVar180,auVar18,auVar145);
        auVar94 = vandps_avx(local_2da0,auVar145);
        auVar148 = vandps_avx(local_2da0,auVar32);
        auVar94 = vcmpps_avx(auVar94,auVar148,1);
        auVar144 = vblendvps_avx(ZEXT1632(auVar103),ZEXT1632(auVar140),auVar94);
        auVar103 = vfmsub213ps_fma(local_2bc0,auVar93,auVar30);
        auVar140 = vfmsub213ps_fma(auVar185,auVar18,auVar33);
        auVar94 = vandps_avx(local_2da0,auVar30);
        auVar148 = vandps_avx(local_2da0,auVar33);
        auVar185 = vcmpps_avx(auVar94,auVar148,1);
        auVar148 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar103),auVar185);
        auVar150 = ZEXT3264(auVar148);
        local_2be0._0_4_ = auVar70._0_4_;
        local_2be0._4_4_ = auVar70._4_4_;
        fStack_2bd8 = auVar70._8_4_;
        fStack_2bd4 = auVar70._12_4_;
        fStack_2bd0 = auVar70._16_4_;
        fStack_2bcc = auVar70._20_4_;
        fStack_2bc8 = auVar70._24_4_;
        auVar34._4_4_ = auVar148._4_4_ * (float)local_2be0._4_4_;
        auVar34._0_4_ = auVar148._0_4_ * (float)local_2be0._0_4_;
        auVar34._8_4_ = auVar148._8_4_ * fStack_2bd8;
        auVar34._12_4_ = auVar148._12_4_ * fStack_2bd4;
        auVar34._16_4_ = auVar148._16_4_ * fStack_2bd0;
        auVar34._20_4_ = auVar148._20_4_ * fStack_2bcc;
        auVar34._24_4_ = auVar148._24_4_ * fStack_2bc8;
        auVar34._28_4_ = auVar185._28_4_;
        auVar103 = vfmadd213ps_fma(local_2d80,auVar144,auVar34);
        auVar103 = vfmadd213ps_fma(local_2c00,auVar142,ZEXT1632(auVar103));
        fVar101 = auVar103._0_4_ + auVar103._0_4_;
        fVar98 = auVar103._4_4_ + auVar103._4_4_;
        fVar99 = auVar103._8_4_ + auVar103._8_4_;
        fVar100 = auVar103._12_4_ + auVar103._12_4_;
        auVar93 = ZEXT1632(CONCAT412(fVar100,CONCAT48(fVar99,CONCAT44(fVar98,fVar101))));
        auVar35._4_4_ = auVar148._4_4_ * fVar110;
        auVar35._0_4_ = auVar148._0_4_ * fVar102;
        auVar35._8_4_ = auVar148._8_4_ * fVar112;
        auVar35._12_4_ = auVar148._12_4_ * fVar114;
        auVar35._16_4_ = auVar148._16_4_ * fVar10;
        auVar35._20_4_ = auVar148._20_4_ * fVar11;
        auVar35._24_4_ = auVar148._24_4_ * fVar12;
        auVar35._28_4_ = auVar94._28_4_;
        auVar103 = vfmadd213ps_fma(local_2ce0,auVar144,auVar35);
        auVar140 = vfmadd213ps_fma(auVar143,auVar142,ZEXT1632(auVar103));
        auVar94 = vrcpps_avx(auVar93);
        auVar181._8_4_ = 0x3f800000;
        auVar181._0_8_ = &DAT_3f8000003f800000;
        auVar181._12_4_ = 0x3f800000;
        auVar181._16_4_ = 0x3f800000;
        auVar181._20_4_ = 0x3f800000;
        auVar181._24_4_ = 0x3f800000;
        auVar181._28_4_ = 0x3f800000;
        auVar183 = ZEXT3264(auVar181);
        auVar103 = vfnmadd213ps_fma(auVar94,auVar93,auVar181);
        auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar94,auVar94);
        auVar185 = ZEXT1632(CONCAT412(auVar103._12_4_ * (auVar140._12_4_ + auVar140._12_4_),
                                      CONCAT48(auVar103._8_4_ * (auVar140._8_4_ + auVar140._8_4_),
                                               CONCAT44(auVar103._4_4_ *
                                                        (auVar140._4_4_ + auVar140._4_4_),
                                                        auVar103._0_4_ *
                                                        (auVar140._0_4_ + auVar140._0_4_)))));
        auVar94 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar185,2);
        auVar143 = vcmpps_avx(auVar185,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar94 = vandps_avx(auVar143,auVar94);
        auVar168._0_8_ = CONCAT44(fVar98,fVar101) ^ 0x8000000080000000;
        auVar168._8_4_ = -fVar99;
        auVar168._12_4_ = -fVar100;
        auVar168._16_4_ = 0x80000000;
        auVar168._20_4_ = 0x80000000;
        auVar168._24_4_ = 0x80000000;
        auVar168._28_4_ = 0x80000000;
        auVar143 = vcmpps_avx(auVar168,auVar93,4);
        auVar94 = vandps_avx(auVar143,auVar94);
        auVar94 = vpslld_avx2(auVar94,0x1f);
        auVar94 = vpsrad_avx2(auVar94,0x1f);
        auVar143 = auVar128 & auVar94;
        auVar94 = vandps_avx(auVar94,auVar128);
        local_2c40 = auVar154;
        local_2c20 = auVar128;
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar143 >> 0x7f,0) != '\0') ||
              (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar143 >> 0xbf,0) != '\0') ||
            (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar143[0x1f] < '\0') {
          local_2780 = auVar148;
          local_2760 = auVar144;
          local_2740 = auVar142;
          local_2720 = auVar185;
          local_2700 = auVar154;
          _local_26e0 = ZEXT1632(auVar17);
          _local_26c0 = auVar130;
        }
      }
      auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
      uVar74 = *(undefined4 *)(local_2e58 + lVar82);
      auVar192._4_4_ = uVar74;
      auVar192._0_4_ = uVar74;
      auVar192._8_4_ = uVar74;
      auVar192._12_4_ = uVar74;
      auVar192._16_4_ = uVar74;
      auVar192._20_4_ = uVar74;
      auVar192._24_4_ = uVar74;
      auVar192._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(local_2e50 + lVar82);
      auVar155._4_4_ = uVar74;
      auVar155._0_4_ = uVar74;
      auVar155._8_4_ = uVar74;
      auVar155._12_4_ = uVar74;
      auVar155._16_4_ = uVar74;
      auVar155._20_4_ = uVar74;
      auVar155._24_4_ = uVar74;
      auVar155._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(local_2ca0._0_8_ + lVar82);
      auVar169._4_4_ = uVar74;
      auVar169._0_4_ = uVar74;
      auVar169._8_4_ = uVar74;
      auVar169._12_4_ = uVar74;
      auVar169._16_4_ = uVar74;
      auVar169._20_4_ = uVar74;
      auVar169._24_4_ = uVar74;
      auVar169._28_4_ = uVar74;
      uVar6 = *(uint *)(local_2e00.super_Precalculations.grid + 0x18);
      pGVar8 = (context->scene->geometries).items[uVar6].ptr;
      uVar4 = pGVar8->mask;
      auVar106._4_4_ = uVar4;
      auVar106._0_4_ = uVar4;
      auVar106._8_4_ = uVar4;
      auVar106._12_4_ = uVar4;
      auVar106._16_4_ = uVar4;
      auVar106._20_4_ = uVar4;
      auVar106._24_4_ = uVar4;
      auVar106._28_4_ = uVar4;
      auVar128 = vpand_avx2(auVar106,*(undefined1 (*) [32])(ray + 0x120));
      auVar148 = vpcmpeqd_avx2(auVar128,_DAT_02020f00);
      auVar128 = auVar94 & ~auVar148;
      local_2dc0 = auVar149;
      local_2d60 = auVar180;
      _local_2be0 = auVar90;
      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar128 >> 0x7f,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar128 >> 0xbf,0) != '\0') ||
          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar128[0x1f] < '\0') {
        uVar74 = *(undefined4 *)(local_2e00.super_Precalculations.grid + 0x1c);
        auVar128 = vandnps_avx(auVar148,auVar94);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar94 = vandps_avx(local_2da0,local_2700);
          auVar148 = vrcpps_avx(local_2700);
          auVar158._8_4_ = 0x3f800000;
          auVar158._0_8_ = &DAT_3f8000003f800000;
          auVar158._12_4_ = 0x3f800000;
          auVar158._16_4_ = 0x3f800000;
          auVar158._20_4_ = 0x3f800000;
          auVar158._24_4_ = 0x3f800000;
          auVar158._28_4_ = 0x3f800000;
          auVar103 = vfnmadd213ps_fma(auVar148,local_2700,auVar158);
          auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar148,auVar148);
          auVar121._8_4_ = 0x219392ef;
          auVar121._0_8_ = 0x219392ef219392ef;
          auVar121._12_4_ = 0x219392ef;
          auVar121._16_4_ = 0x219392ef;
          auVar121._20_4_ = 0x219392ef;
          auVar121._24_4_ = 0x219392ef;
          auVar121._28_4_ = 0x219392ef;
          auVar148 = vcmpps_avx(auVar94,auVar121,5);
          auVar94 = vandps_avx(auVar148,ZEXT1632(auVar103));
          auVar52._4_4_ = auVar94._4_4_ * (float)local_26c0._4_4_;
          auVar52._0_4_ = auVar94._0_4_ * (float)local_26c0._0_4_;
          auVar52._8_4_ = auVar94._8_4_ * fStack_26b8;
          auVar52._12_4_ = auVar94._12_4_ * fStack_26b4;
          auVar52._16_4_ = auVar94._16_4_ * fStack_26b0;
          auVar52._20_4_ = auVar94._20_4_ * fStack_26ac;
          auVar52._24_4_ = auVar94._24_4_ * fStack_26a8;
          auVar52._28_4_ = auVar148._28_4_;
          auVar149 = vminps_avx(auVar52,auVar158);
          auVar53._4_4_ = auVar94._4_4_ * (float)local_26e0._4_4_;
          auVar53._0_4_ = auVar94._0_4_ * (float)local_26e0._0_4_;
          auVar53._8_4_ = auVar94._8_4_ * fStack_26d8;
          auVar53._12_4_ = auVar94._12_4_ * fStack_26d4;
          auVar53._16_4_ = auVar94._16_4_ * fStack_26d0;
          auVar53._20_4_ = auVar94._20_4_ * fStack_26cc;
          auVar53._24_4_ = auVar94._24_4_ * fStack_26c8;
          auVar53._28_4_ = auVar94._28_4_;
          auVar142 = vminps_avx(auVar53,auVar158);
          uVar5 = *(undefined4 *)(local_2e68 + lVar82 + -4);
          auVar134._4_4_ = uVar5;
          auVar134._0_4_ = uVar5;
          auVar134._8_4_ = uVar5;
          auVar134._12_4_ = uVar5;
          auVar134._16_4_ = uVar5;
          auVar134._20_4_ = uVar5;
          auVar134._24_4_ = uVar5;
          auVar134._28_4_ = uVar5;
          uVar5 = *(undefined4 *)(local_2e60 + lVar82);
          auVar138._4_4_ = uVar5;
          auVar138._0_4_ = uVar5;
          auVar138._8_4_ = uVar5;
          auVar138._12_4_ = uVar5;
          auVar138._16_4_ = uVar5;
          auVar138._20_4_ = uVar5;
          auVar138._24_4_ = uVar5;
          auVar138._28_4_ = uVar5;
          auVar148 = vpsrld_avx2(auVar134,0x10);
          auVar144 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar94 = vpblendw_avx2(auVar134,auVar144,0xaa);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar178._8_4_ = 0x39000000;
          auVar178._0_8_ = 0x3900000039000000;
          auVar178._12_4_ = 0x39000000;
          auVar183 = ZEXT3264(CONCAT428(0x39000000,
                                        CONCAT424(0x39000000,
                                                  CONCAT420(0x39000000,
                                                            CONCAT416(0x39000000,auVar178)))));
          auVar148 = vcvtdq2ps_avx(auVar148);
          auVar143 = vsubps_avx(auVar158,auVar149);
          auVar143 = vsubps_avx(auVar143,auVar142);
          auVar162._0_4_ = auVar143._0_4_ * auVar94._0_4_ * 0.00012207031;
          auVar162._4_4_ = auVar143._4_4_ * auVar94._4_4_ * 0.00012207031;
          auVar162._8_4_ = auVar143._8_4_ * auVar94._8_4_ * 0.00012207031;
          auVar162._12_4_ = auVar143._12_4_ * auVar94._12_4_ * 0.00012207031;
          auVar162._16_4_ = auVar143._16_4_ * auVar94._16_4_ * 0.00012207031;
          auVar162._20_4_ = auVar143._20_4_ * auVar94._20_4_ * 0.00012207031;
          auVar162._24_4_ = auVar143._24_4_ * auVar94._24_4_ * 0.00012207031;
          auVar162._28_4_ = 0;
          auVar54._4_4_ = auVar143._4_4_ * auVar148._4_4_ * 0.00012207031;
          auVar54._0_4_ = auVar143._0_4_ * auVar148._0_4_ * 0.00012207031;
          auVar54._8_4_ = auVar143._8_4_ * auVar148._8_4_ * 0.00012207031;
          auVar54._12_4_ = auVar143._12_4_ * auVar148._12_4_ * 0.00012207031;
          auVar54._16_4_ = auVar143._16_4_ * auVar148._16_4_ * 0.00012207031;
          auVar54._20_4_ = auVar143._20_4_ * auVar148._20_4_ * 0.00012207031;
          auVar54._24_4_ = auVar143._24_4_ * auVar148._24_4_ * 0.00012207031;
          auVar54._28_4_ = auVar94._28_4_;
          auVar94 = vpblendw_avx2(auVar138,auVar144,0xaa);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar140._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar140._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar140._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar140._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar55._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar55._0_16_ = auVar140;
          auVar55._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar55._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar55._28_4_ = auVar94._28_4_;
          auVar150 = ZEXT3264(auVar55);
          auVar103 = vfmadd231ps_fma(auVar162,auVar142,auVar55);
          auVar94 = vpsrld_avx2(auVar138,0x10);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar56._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar56._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar56._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar56._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar56._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar56._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar56._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar56._28_4_ = auVar94._28_4_;
          auVar17 = vfmadd231ps_fma(auVar54,auVar142,auVar56);
          uVar5 = *(undefined4 *)(local_2e68 + lVar82);
          auVar122._4_4_ = uVar5;
          auVar122._0_4_ = uVar5;
          auVar122._8_4_ = uVar5;
          auVar122._12_4_ = uVar5;
          auVar122._16_4_ = uVar5;
          auVar122._20_4_ = uVar5;
          auVar122._24_4_ = uVar5;
          auVar122._28_4_ = uVar5;
          auVar94 = vpblendw_avx2(auVar122,auVar144,0xaa);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar57._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar57._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar57._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar57._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar57._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar57._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar57._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar57._28_4_ = auVar94._28_4_;
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar149,auVar57);
          auVar163 = ZEXT1664(auVar103);
          auVar94 = vpsrld_avx2(auVar122,0x10);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar58._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar58._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar58._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar58._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar58._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar58._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar58._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar58._28_4_ = auVar94._28_4_;
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar149,auVar58);
          local_2b80 = local_2740._0_8_;
          uStack_2b78 = local_2740._8_8_;
          uStack_2b70 = local_2740._16_8_;
          uStack_2b68 = local_2740._24_8_;
          local_2b60 = local_2760._0_8_;
          uStack_2b58 = local_2760._8_8_;
          uStack_2b50 = local_2760._16_8_;
          uStack_2b48 = local_2760._24_8_;
          local_2b40 = local_2780._0_8_;
          uStack_2b38 = local_2780._8_8_;
          uStack_2b30 = local_2780._16_8_;
          uStack_2b28 = local_2780._24_8_;
          local_2b20 = ZEXT1632(auVar103);
          local_2b00 = ZEXT1632(auVar17);
          local_2ae0._4_4_ = uVar74;
          local_2ae0._0_4_ = uVar74;
          local_2ae0._8_4_ = uVar74;
          local_2ae0._12_4_ = uVar74;
          local_2ae0._16_4_ = uVar74;
          local_2ae0._20_4_ = uVar74;
          local_2ae0._24_4_ = uVar74;
          local_2ae0._28_4_ = uVar74;
          auVar149 = vpcmpeqd_avx2(local_2ae0,local_2ae0);
          local_2aa0 = context->user->instID[0];
          local_2a80 = context->user->instPrimID[0];
          local_2d60 = *(undefined1 (*) [32])(ray + 0x100);
          auVar148 = vblendvps_avx(local_2d60,local_2720,auVar128);
          *(undefined1 (*) [32])(ray + 0x100) = auVar148;
          local_2df0.valid = (int *)local_2d40;
          local_2df0.geometryUserPtr = pGVar8->userPtr;
          local_2df0.context = context->user;
          local_2df0.hit = (RTCHitN *)&local_2b80;
          local_2df0.N = 8;
          auVar94 = local_2d60;
          local_2df0.ray = (RTCRayN *)ray;
          local_2d80 = auVar192;
          local_2d40 = auVar128;
          local_2d00 = auVar169;
          local_2ce0 = auVar155;
          local_2ac0 = uVar6;
          uStack_2abc = uVar6;
          uStack_2ab8 = uVar6;
          uStack_2ab4 = uVar6;
          uStack_2ab0 = uVar6;
          uStack_2aac = uVar6;
          uStack_2aa8 = uVar6;
          uStack_2aa4 = uVar6;
          uStack_2a9c = local_2aa0;
          uStack_2a98 = local_2aa0;
          uStack_2a94 = local_2aa0;
          uStack_2a90 = local_2aa0;
          uStack_2a8c = local_2aa0;
          uStack_2a88 = local_2aa0;
          uStack_2a84 = local_2aa0;
          uStack_2a7c = local_2a80;
          uStack_2a78 = local_2a80;
          uStack_2a74 = local_2a80;
          uStack_2a70 = local_2a80;
          uStack_2a6c = local_2a80;
          uStack_2a68 = local_2a80;
          uStack_2a64 = local_2a80;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar128 = ZEXT1632(auVar149._0_16_);
            auVar150 = ZEXT1664(auVar140);
            auVar163 = ZEXT1664(auVar103);
            auVar183 = ZEXT1664(auVar178);
            (*pGVar8->occlusionFilterN)(&local_2df0);
            auVar186._8_56_ = extraout_var;
            auVar186._0_8_ = extraout_XMM1_Qa;
            auVar148 = auVar186._0_32_;
            auVar149 = vpcmpeqd_avx2(auVar128,auVar128);
            auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar186 = ZEXT3264(local_2da0);
            auVar94 = local_2d60;
            auVar180 = local_2d60;
          }
          local_2d60 = auVar180;
          auVar128 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2d40);
          auVar142 = auVar149 & ~auVar128;
          auVar148 = vpcmpeqd_avx2(auVar148,auVar148);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar142[0x1f]) {
            auVar128 = auVar128 ^ auVar148;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              auVar128 = ZEXT1632(auVar149._0_16_);
              auVar150 = ZEXT1664(auVar150._0_16_);
              auVar163 = ZEXT1664(auVar163._0_16_);
              auVar183 = ZEXT1664(auVar183._0_16_);
              local_2d60 = auVar94;
              (*p_Var9)(&local_2df0);
              auVar149 = vpcmpeqd_avx2(auVar128,auVar128);
              auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar186 = ZEXT3264(local_2da0);
              auVar94 = local_2d60;
            }
            auVar148 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2d40);
            auVar128 = auVar148 ^ auVar149;
            auVar125._8_4_ = 0xff800000;
            auVar125._0_8_ = 0xff800000ff800000;
            auVar125._12_4_ = 0xff800000;
            auVar125._16_4_ = 0xff800000;
            auVar125._20_4_ = 0xff800000;
            auVar125._24_4_ = 0xff800000;
            auVar125._28_4_ = 0xff800000;
            auVar148 = vblendvps_avx(auVar125,*(undefined1 (*) [32])(local_2df0.ray + 0x100),
                                     auVar148);
            *(undefined1 (*) [32])(local_2df0.ray + 0x100) = auVar148;
          }
          auVar94 = vblendvps_avx(auVar94,*(undefined1 (*) [32])pRVar1,auVar128);
          *(undefined1 (*) [32])pRVar1 = auVar94;
          auVar192 = local_2d80;
          auVar155 = local_2ce0;
          auVar169 = local_2d00;
        }
        auVar149 = vandnps_avx(auVar128,local_2dc0);
      }
      auVar201 = ZEXT3264(auVar149);
      if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar149 >> 0x7f,0) == '\0') &&
            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar149 >> 0xbf,0) == '\0') &&
          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar149[0x1f]) {
        auVar128 = vpcmpeqd_avx2(auVar192,auVar192);
        auVar193 = ZEXT3264(auVar128);
        break;
      }
      auVar128 = *(undefined1 (*) [32])ray;
      auVar94 = *(undefined1 (*) [32])(ray + 0x20);
      auVar148 = *(undefined1 (*) [32])(ray + 0x40);
      local_2d00 = vsubps_avx(_local_2c60,auVar128);
      local_2d60 = vsubps_avx(local_2c80,auVar94);
      local_2ba0 = vsubps_avx(local_2640,auVar148);
      auVar142 = vsubps_avx(local_2660,auVar128);
      auVar143 = vsubps_avx(local_2680,auVar94);
      auVar144 = vsubps_avx(local_26a0,auVar148);
      auVar128 = vsubps_avx(auVar192,auVar128);
      auVar94 = vsubps_avx(auVar155,auVar94);
      auVar148 = vsubps_avx(auVar169,auVar148);
      local_2bc0 = vsubps_avx(auVar128,local_2d00);
      local_2c00 = vsubps_avx(auVar94,local_2d60);
      _local_2be0 = vsubps_avx(auVar148,local_2ba0);
      auVar131._0_4_ = auVar128._0_4_ + local_2d00._0_4_;
      auVar131._4_4_ = auVar128._4_4_ + local_2d00._4_4_;
      auVar131._8_4_ = auVar128._8_4_ + local_2d00._8_4_;
      auVar131._12_4_ = auVar128._12_4_ + local_2d00._12_4_;
      auVar131._16_4_ = auVar128._16_4_ + local_2d00._16_4_;
      auVar131._20_4_ = auVar128._20_4_ + local_2d00._20_4_;
      auVar131._24_4_ = auVar128._24_4_ + local_2d00._24_4_;
      auVar131._28_4_ = auVar128._28_4_ + local_2d00._28_4_;
      auVar156._0_4_ = local_2d60._0_4_ + auVar94._0_4_;
      auVar156._4_4_ = local_2d60._4_4_ + auVar94._4_4_;
      auVar156._8_4_ = local_2d60._8_4_ + auVar94._8_4_;
      auVar156._12_4_ = local_2d60._12_4_ + auVar94._12_4_;
      auVar156._16_4_ = local_2d60._16_4_ + auVar94._16_4_;
      auVar156._20_4_ = local_2d60._20_4_ + auVar94._20_4_;
      auVar156._24_4_ = local_2d60._24_4_ + auVar94._24_4_;
      auVar156._28_4_ = local_2d60._28_4_ + auVar94._28_4_;
      fVar191 = local_2ba0._0_4_;
      auVar170._0_4_ = fVar191 + auVar148._0_4_;
      fVar194 = local_2ba0._4_4_;
      auVar170._4_4_ = fVar194 + auVar148._4_4_;
      fVar195 = local_2ba0._8_4_;
      auVar170._8_4_ = fVar195 + auVar148._8_4_;
      fVar196 = local_2ba0._12_4_;
      auVar170._12_4_ = fVar196 + auVar148._12_4_;
      fVar197 = local_2ba0._16_4_;
      auVar170._16_4_ = fVar197 + auVar148._16_4_;
      fVar198 = local_2ba0._20_4_;
      auVar170._20_4_ = fVar198 + auVar148._20_4_;
      fVar199 = local_2ba0._24_4_;
      auVar170._24_4_ = fVar199 + auVar148._24_4_;
      fVar102 = auVar148._28_4_;
      auVar170._28_4_ = local_2ba0._28_4_ + fVar102;
      auVar190._0_4_ = auVar156._0_4_ * local_2be0._0_4_;
      auVar190._4_4_ = auVar156._4_4_ * local_2be0._4_4_;
      auVar190._8_4_ = auVar156._8_4_ * local_2be0._8_4_;
      auVar190._12_4_ = auVar156._12_4_ * local_2be0._12_4_;
      auVar190._16_4_ = auVar156._16_4_ * local_2be0._16_4_;
      auVar190._20_4_ = auVar156._20_4_ * local_2be0._20_4_;
      auVar190._28_36_ = auVar187._28_36_;
      auVar190._24_4_ = auVar156._24_4_ * local_2be0._24_4_;
      auVar17 = vfmsub231ps_fma(auVar190._0_32_,local_2c00,auVar170);
      auVar183._0_4_ = auVar170._0_4_ * local_2bc0._0_4_;
      auVar183._4_4_ = auVar170._4_4_ * local_2bc0._4_4_;
      auVar183._8_4_ = auVar170._8_4_ * local_2bc0._8_4_;
      auVar183._12_4_ = auVar170._12_4_ * local_2bc0._12_4_;
      auVar183._16_4_ = auVar170._16_4_ * local_2bc0._16_4_;
      auVar183._20_4_ = auVar170._20_4_ * local_2bc0._20_4_;
      auVar183._28_36_ = auVar186._28_36_;
      auVar183._24_4_ = auVar170._24_4_ * local_2bc0._24_4_;
      auVar103 = vfmsub231ps_fma(auVar183._0_32_,_local_2be0,auVar131);
      auVar36._4_4_ = auVar131._4_4_ * local_2c00._4_4_;
      auVar36._0_4_ = auVar131._0_4_ * local_2c00._0_4_;
      auVar36._8_4_ = auVar131._8_4_ * local_2c00._8_4_;
      auVar36._12_4_ = auVar131._12_4_ * local_2c00._12_4_;
      auVar36._16_4_ = auVar131._16_4_ * local_2c00._16_4_;
      auVar36._20_4_ = auVar131._20_4_ * local_2c00._20_4_;
      auVar36._24_4_ = auVar131._24_4_ * local_2c00._24_4_;
      auVar36._28_4_ = auVar131._28_4_;
      auVar140 = vfmsub231ps_fma(auVar36,local_2bc0,auVar156);
      fVar111 = *(float *)(ray + 0xc0);
      fVar113 = *(float *)(ray + 0xc4);
      fVar115 = *(float *)(ray + 200);
      fVar116 = *(float *)(ray + 0xcc);
      fVar117 = *(float *)(ray + 0xd0);
      fVar66 = *(float *)(ray + 0xd4);
      fVar152 = *(float *)(ray + 0xd8);
      auVar70 = *(undefined1 (*) [28])(ray + 0xc0);
      auVar132._0_4_ = fVar111 * auVar140._0_4_;
      auVar132._4_4_ = fVar113 * auVar140._4_4_;
      auVar132._8_4_ = fVar115 * auVar140._8_4_;
      auVar132._12_4_ = fVar116 * auVar140._12_4_;
      auVar132._16_4_ = fVar117 * 0.0;
      auVar132._20_4_ = fVar66 * 0.0;
      auVar132._24_4_ = fVar152 * 0.0;
      auVar132._28_4_ = 0;
      local_2ce0 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar103 = vfmadd231ps_fma(auVar132,local_2ce0,ZEXT1632(auVar103));
      local_2d80 = *(undefined1 (*) [32])(ray + 0x80);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),local_2d80,ZEXT1632(auVar17));
      local_2c20 = vsubps_avx(local_2d60,auVar143);
      auVar180 = vsubps_avx(local_2ba0,auVar144);
      auVar157._0_4_ = local_2d60._0_4_ + auVar143._0_4_;
      auVar157._4_4_ = local_2d60._4_4_ + auVar143._4_4_;
      auVar157._8_4_ = local_2d60._8_4_ + auVar143._8_4_;
      auVar157._12_4_ = local_2d60._12_4_ + auVar143._12_4_;
      auVar157._16_4_ = local_2d60._16_4_ + auVar143._16_4_;
      auVar157._20_4_ = local_2d60._20_4_ + auVar143._20_4_;
      auVar157._24_4_ = local_2d60._24_4_ + auVar143._24_4_;
      auVar157._28_4_ = local_2d60._28_4_ + auVar143._28_4_;
      auVar200._0_4_ = fVar191 + auVar144._0_4_;
      auVar200._4_4_ = fVar194 + auVar144._4_4_;
      auVar200._8_4_ = fVar195 + auVar144._8_4_;
      auVar200._12_4_ = fVar196 + auVar144._12_4_;
      auVar200._16_4_ = fVar197 + auVar144._16_4_;
      auVar200._20_4_ = fVar198 + auVar144._20_4_;
      auVar200._24_4_ = fVar199 + auVar144._24_4_;
      fVar110 = auVar144._28_4_;
      auVar200._28_4_ = local_2ba0._28_4_ + fVar110;
      fVar165 = auVar180._0_4_;
      fVar172 = auVar180._4_4_;
      auVar37._4_4_ = fVar172 * auVar157._4_4_;
      auVar37._0_4_ = fVar165 * auVar157._0_4_;
      fVar173 = auVar180._8_4_;
      auVar37._8_4_ = fVar173 * auVar157._8_4_;
      fVar174 = auVar180._12_4_;
      auVar37._12_4_ = fVar174 * auVar157._12_4_;
      fVar175 = auVar180._16_4_;
      auVar37._16_4_ = fVar175 * auVar157._16_4_;
      fVar176 = auVar180._20_4_;
      auVar37._20_4_ = fVar176 * auVar157._20_4_;
      fVar177 = auVar180._24_4_;
      auVar37._24_4_ = fVar177 * auVar157._24_4_;
      auVar37._28_4_ = fVar110;
      auVar140 = vfmsub231ps_fma(auVar37,local_2c20,auVar200);
      auVar185 = vsubps_avx(local_2d00,auVar142);
      fVar112 = auVar185._0_4_;
      fVar10 = auVar185._4_4_;
      auVar38._4_4_ = auVar200._4_4_ * fVar10;
      auVar38._0_4_ = auVar200._0_4_ * fVar112;
      fVar12 = auVar185._8_4_;
      auVar38._8_4_ = auVar200._8_4_ * fVar12;
      fVar98 = auVar185._12_4_;
      auVar38._12_4_ = auVar200._12_4_ * fVar98;
      fVar100 = auVar185._16_4_;
      auVar38._16_4_ = auVar200._16_4_ * fVar100;
      fVar14 = auVar185._20_4_;
      auVar38._20_4_ = auVar200._20_4_ * fVar14;
      fVar16 = auVar185._24_4_;
      auVar38._24_4_ = auVar200._24_4_ * fVar16;
      auVar38._28_4_ = auVar200._28_4_;
      auVar161._0_4_ = auVar142._0_4_ + local_2d00._0_4_;
      auVar161._4_4_ = auVar142._4_4_ + local_2d00._4_4_;
      auVar161._8_4_ = auVar142._8_4_ + local_2d00._8_4_;
      auVar161._12_4_ = auVar142._12_4_ + local_2d00._12_4_;
      auVar161._16_4_ = auVar142._16_4_ + local_2d00._16_4_;
      auVar161._20_4_ = auVar142._20_4_ + local_2d00._20_4_;
      auVar161._24_4_ = auVar142._24_4_ + local_2d00._24_4_;
      auVar161._28_4_ = auVar142._28_4_ + local_2d00._28_4_;
      auVar17 = vfmsub231ps_fma(auVar38,auVar180,auVar161);
      fVar114 = local_2c20._0_4_;
      fVar11 = local_2c20._4_4_;
      auVar39._4_4_ = auVar161._4_4_ * fVar11;
      auVar39._0_4_ = auVar161._0_4_ * fVar114;
      fVar101 = local_2c20._8_4_;
      auVar39._8_4_ = auVar161._8_4_ * fVar101;
      fVar99 = local_2c20._12_4_;
      auVar39._12_4_ = auVar161._12_4_ * fVar99;
      fVar13 = local_2c20._16_4_;
      auVar39._16_4_ = auVar161._16_4_ * fVar13;
      fVar15 = local_2c20._20_4_;
      auVar39._20_4_ = auVar161._20_4_ * fVar15;
      fVar109 = local_2c20._24_4_;
      auVar39._24_4_ = auVar161._24_4_ * fVar109;
      auVar39._28_4_ = auVar161._28_4_;
      auVar178 = vfmsub231ps_fma(auVar39,auVar185,auVar157);
      auVar40._4_4_ = fVar113 * auVar178._4_4_;
      auVar40._0_4_ = fVar111 * auVar178._0_4_;
      auVar40._8_4_ = fVar115 * auVar178._8_4_;
      auVar40._12_4_ = fVar116 * auVar178._12_4_;
      auVar40._16_4_ = fVar117 * 0.0;
      auVar40._20_4_ = fVar66 * 0.0;
      auVar40._24_4_ = fVar152 * 0.0;
      auVar40._28_4_ = auVar157._28_4_;
      auVar163 = ZEXT3264(local_2ce0);
      auVar17 = vfmadd231ps_fma(auVar40,local_2ce0,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_2d80,ZEXT1632(auVar140));
      auVar93 = vsubps_avx(auVar142,auVar128);
      auVar107._0_4_ = auVar142._0_4_ + auVar128._0_4_;
      auVar107._4_4_ = auVar142._4_4_ + auVar128._4_4_;
      auVar107._8_4_ = auVar142._8_4_ + auVar128._8_4_;
      auVar107._12_4_ = auVar142._12_4_ + auVar128._12_4_;
      auVar107._16_4_ = auVar142._16_4_ + auVar128._16_4_;
      auVar107._20_4_ = auVar142._20_4_ + auVar128._20_4_;
      auVar107._24_4_ = auVar142._24_4_ + auVar128._24_4_;
      auVar107._28_4_ = auVar142._28_4_ + auVar128._28_4_;
      auVar188 = vsubps_avx(auVar143,auVar94);
      auVar95._0_4_ = auVar143._0_4_ + auVar94._0_4_;
      auVar95._4_4_ = auVar143._4_4_ + auVar94._4_4_;
      auVar95._8_4_ = auVar143._8_4_ + auVar94._8_4_;
      auVar95._12_4_ = auVar143._12_4_ + auVar94._12_4_;
      auVar95._16_4_ = auVar143._16_4_ + auVar94._16_4_;
      auVar95._20_4_ = auVar143._20_4_ + auVar94._20_4_;
      auVar95._24_4_ = auVar143._24_4_ + auVar94._24_4_;
      auVar95._28_4_ = auVar143._28_4_ + auVar94._28_4_;
      auVar18 = vsubps_avx(auVar144,auVar148);
      auVar183 = ZEXT3264(auVar18);
      auVar120._0_4_ = auVar144._0_4_ + auVar148._0_4_;
      auVar120._4_4_ = auVar144._4_4_ + auVar148._4_4_;
      auVar120._8_4_ = auVar144._8_4_ + auVar148._8_4_;
      auVar120._12_4_ = auVar144._12_4_ + auVar148._12_4_;
      auVar120._16_4_ = auVar144._16_4_ + auVar148._16_4_;
      auVar120._20_4_ = auVar144._20_4_ + auVar148._20_4_;
      auVar120._24_4_ = auVar144._24_4_ + auVar148._24_4_;
      auVar120._28_4_ = fVar110 + fVar102;
      auVar41._4_4_ = auVar18._4_4_ * auVar95._4_4_;
      auVar41._0_4_ = auVar18._0_4_ * auVar95._0_4_;
      auVar41._8_4_ = auVar18._8_4_ * auVar95._8_4_;
      auVar41._12_4_ = auVar18._12_4_ * auVar95._12_4_;
      auVar41._16_4_ = auVar18._16_4_ * auVar95._16_4_;
      auVar41._20_4_ = auVar18._20_4_ * auVar95._20_4_;
      auVar41._24_4_ = auVar18._24_4_ * auVar95._24_4_;
      auVar41._28_4_ = fVar102;
      auVar178 = vfmsub231ps_fma(auVar41,auVar188,auVar120);
      auVar42._4_4_ = auVar93._4_4_ * auVar120._4_4_;
      auVar42._0_4_ = auVar93._0_4_ * auVar120._0_4_;
      auVar42._8_4_ = auVar93._8_4_ * auVar120._8_4_;
      auVar42._12_4_ = auVar93._12_4_ * auVar120._12_4_;
      auVar42._16_4_ = auVar93._16_4_ * auVar120._16_4_;
      auVar42._20_4_ = auVar93._20_4_ * auVar120._20_4_;
      auVar42._24_4_ = auVar93._24_4_ * auVar120._24_4_;
      auVar42._28_4_ = auVar120._28_4_;
      auVar140 = vfmsub231ps_fma(auVar42,auVar18,auVar107);
      auVar43._4_4_ = auVar188._4_4_ * auVar107._4_4_;
      auVar43._0_4_ = auVar188._0_4_ * auVar107._0_4_;
      auVar43._8_4_ = auVar188._8_4_ * auVar107._8_4_;
      auVar43._12_4_ = auVar188._12_4_ * auVar107._12_4_;
      auVar43._16_4_ = auVar188._16_4_ * auVar107._16_4_;
      auVar43._20_4_ = auVar188._20_4_ * auVar107._20_4_;
      auVar43._24_4_ = auVar188._24_4_ * auVar107._24_4_;
      auVar43._28_4_ = auVar107._28_4_;
      auVar141 = vfmsub231ps_fma(auVar43,auVar93,auVar95);
      auVar44._4_4_ = fVar113 * auVar141._4_4_;
      auVar44._0_4_ = fVar111 * auVar141._0_4_;
      auVar44._8_4_ = fVar115 * auVar141._8_4_;
      auVar44._12_4_ = fVar116 * auVar141._12_4_;
      auVar44._16_4_ = fVar117 * 0.0;
      auVar44._20_4_ = fVar66 * 0.0;
      auVar44._24_4_ = fVar152 * 0.0;
      auVar44._28_4_ = auVar95._28_4_;
      auVar140 = vfmadd231ps_fma(auVar44,local_2ce0,ZEXT1632(auVar140));
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_2d80,ZEXT1632(auVar178));
      auVar146 = ZEXT1632(CONCAT412(auVar140._12_4_ + auVar103._12_4_ + auVar17._12_4_,
                                    CONCAT48(auVar140._8_4_ + auVar103._8_4_ + auVar17._8_4_,
                                             CONCAT44(auVar140._4_4_ +
                                                      auVar103._4_4_ + auVar17._4_4_,
                                                      auVar140._0_4_ +
                                                      auVar103._0_4_ + auVar17._0_4_))));
      auVar150 = ZEXT3264(auVar146);
      auVar186 = ZEXT3264(local_2da0);
      auVar128 = vandps_avx(auVar146,local_2da0);
      fVar102 = auVar128._0_4_ * 1.1920929e-07;
      fVar110 = auVar128._4_4_ * 1.1920929e-07;
      auVar45._4_4_ = fVar110;
      auVar45._0_4_ = fVar102;
      fVar111 = auVar128._8_4_ * 1.1920929e-07;
      auVar45._8_4_ = fVar111;
      fVar113 = auVar128._12_4_ * 1.1920929e-07;
      auVar45._12_4_ = fVar113;
      fVar115 = auVar128._16_4_ * 1.1920929e-07;
      auVar45._16_4_ = fVar115;
      fVar116 = auVar128._20_4_ * 1.1920929e-07;
      auVar45._20_4_ = fVar116;
      fVar117 = auVar128._24_4_ * 1.1920929e-07;
      auVar45._24_4_ = fVar117;
      auVar45._28_4_ = auVar128._28_4_;
      auVar133 = ZEXT1632(auVar103);
      auVar94 = vminps_avx(auVar133,ZEXT1632(auVar17));
      auVar94 = vminps_avx(auVar94,ZEXT1632(auVar140));
      auVar137._0_8_ = CONCAT44(fVar110,fVar102) ^ 0x8000000080000000;
      auVar137._8_4_ = -fVar111;
      auVar137._12_4_ = -fVar113;
      auVar137._16_4_ = -fVar115;
      auVar137._20_4_ = -fVar116;
      auVar137._24_4_ = -fVar117;
      auVar137._28_4_ = auVar128._28_4_ ^ 0x80000000;
      auVar148 = vcmpps_avx(auVar94,auVar137,5);
      auVar142 = vmaxps_avx(auVar133,ZEXT1632(auVar17));
      auVar128 = vmaxps_avx(auVar142,ZEXT1632(auVar140));
      auVar128 = vcmpps_avx(auVar128,auVar45,2);
      auVar143 = vorps_avx(auVar148,auVar128);
      auVar144 = auVar149 & auVar143;
      auVar128 = vandps_avx(auVar143,auVar149);
      auVar94 = auVar128;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        auVar46._4_4_ = fVar11 * local_2be0._4_4_;
        auVar46._0_4_ = fVar114 * local_2be0._0_4_;
        auVar46._8_4_ = fVar101 * local_2be0._8_4_;
        auVar46._12_4_ = fVar99 * local_2be0._12_4_;
        auVar46._16_4_ = fVar13 * local_2be0._16_4_;
        auVar46._20_4_ = fVar15 * local_2be0._20_4_;
        auVar46._24_4_ = fVar109 * local_2be0._24_4_;
        auVar46._28_4_ = auVar143._28_4_;
        local_2c60._4_4_ = fVar10 * local_2c00._4_4_;
        local_2c60._0_4_ = fVar112 * local_2c00._0_4_;
        fStack_2c58 = fVar12 * local_2c00._8_4_;
        fStack_2c54 = fVar98 * local_2c00._12_4_;
        fStack_2c50 = fVar100 * local_2c00._16_4_;
        fStack_2c4c = fVar14 * local_2c00._20_4_;
        fStack_2c48 = fVar16 * local_2c00._24_4_;
        uStack_2c44 = auVar148._28_4_;
        auVar103 = vfmsub213ps_fma(local_2c00,auVar180,auVar46);
        auVar47._4_4_ = auVar188._4_4_ * fVar172;
        auVar47._0_4_ = auVar188._0_4_ * fVar165;
        auVar47._8_4_ = auVar188._8_4_ * fVar173;
        auVar47._12_4_ = auVar188._12_4_ * fVar174;
        auVar47._16_4_ = auVar188._16_4_ * fVar175;
        auVar47._20_4_ = auVar188._20_4_ * fVar176;
        auVar47._24_4_ = auVar188._24_4_ * fVar177;
        auVar47._28_4_ = auVar148._28_4_;
        auVar48._4_4_ = fVar10 * auVar18._4_4_;
        auVar48._0_4_ = fVar112 * auVar18._0_4_;
        auVar48._8_4_ = fVar12 * auVar18._8_4_;
        auVar48._12_4_ = fVar98 * auVar18._12_4_;
        auVar48._16_4_ = fVar100 * auVar18._16_4_;
        auVar48._20_4_ = fVar14 * auVar18._20_4_;
        auVar48._24_4_ = fVar16 * auVar18._24_4_;
        auVar48._28_4_ = auVar142._28_4_;
        auVar140 = vfmsub213ps_fma(auVar18,local_2c20,auVar47);
        auVar94 = vandps_avx(local_2da0,auVar46);
        auVar148 = vandps_avx(local_2da0,auVar47);
        auVar94 = vcmpps_avx(auVar94,auVar148,1);
        auVar142 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar103),auVar94);
        auVar147._0_4_ = auVar93._0_4_ * fVar114;
        auVar147._4_4_ = auVar93._4_4_ * fVar11;
        auVar147._8_4_ = auVar93._8_4_ * fVar101;
        auVar147._12_4_ = auVar93._12_4_ * fVar99;
        auVar147._16_4_ = auVar93._16_4_ * fVar13;
        auVar147._20_4_ = auVar93._20_4_ * fVar15;
        auVar147._24_4_ = auVar93._24_4_ * fVar109;
        auVar147._28_4_ = 0;
        auVar103 = vfmsub213ps_fma(auVar93,auVar180,auVar48);
        auVar49._4_4_ = fVar172 * local_2bc0._4_4_;
        auVar49._0_4_ = fVar165 * local_2bc0._0_4_;
        auVar49._8_4_ = fVar173 * local_2bc0._8_4_;
        auVar49._12_4_ = fVar174 * local_2bc0._12_4_;
        auVar49._16_4_ = fVar175 * local_2bc0._16_4_;
        auVar49._20_4_ = fVar176 * local_2bc0._20_4_;
        auVar49._24_4_ = fVar177 * local_2bc0._24_4_;
        auVar49._28_4_ = auVar148._28_4_;
        auVar140 = vfmsub213ps_fma(_local_2be0,auVar185,auVar49);
        auVar94 = vandps_avx(local_2da0,auVar49);
        auVar148 = vandps_avx(local_2da0,auVar48);
        auVar94 = vcmpps_avx(auVar94,auVar148,1);
        auVar143 = vblendvps_avx(ZEXT1632(auVar103),ZEXT1632(auVar140),auVar94);
        auVar103 = vfmsub213ps_fma(local_2bc0,local_2c20,_local_2c60);
        auVar140 = vfmsub213ps_fma(auVar188,auVar185,auVar147);
        auVar94 = vandps_avx(local_2da0,_local_2c60);
        auVar148 = vandps_avx(local_2da0,auVar147);
        auVar94 = vcmpps_avx(auVar94,auVar148,1);
        auVar148 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar103),auVar94);
        local_2ea0 = auVar70._0_4_;
        fStack_2e9c = auVar70._4_4_;
        fStack_2e98 = auVar70._8_4_;
        fStack_2e94 = auVar70._12_4_;
        fStack_2e90 = auVar70._16_4_;
        fStack_2e8c = auVar70._20_4_;
        fStack_2e88 = auVar70._24_4_;
        auVar50._4_4_ = auVar148._4_4_ * fStack_2e9c;
        auVar50._0_4_ = auVar148._0_4_ * local_2ea0;
        auVar50._8_4_ = auVar148._8_4_ * fStack_2e98;
        auVar50._12_4_ = auVar148._12_4_ * fStack_2e94;
        auVar50._16_4_ = auVar148._16_4_ * fStack_2e90;
        auVar50._20_4_ = auVar148._20_4_ * fStack_2e8c;
        auVar50._24_4_ = auVar148._24_4_ * fStack_2e88;
        auVar50._28_4_ = auVar94._28_4_;
        auVar103 = vfmadd213ps_fma(local_2ce0,auVar143,auVar50);
        auVar103 = vfmadd213ps_fma(local_2d80,auVar142,ZEXT1632(auVar103));
        fVar102 = auVar103._0_4_ + auVar103._0_4_;
        fVar110 = auVar103._4_4_ + auVar103._4_4_;
        fVar112 = auVar103._8_4_ + auVar103._8_4_;
        fVar114 = auVar103._12_4_ + auVar103._12_4_;
        auVar93 = ZEXT1632(CONCAT412(fVar114,CONCAT48(fVar112,CONCAT44(fVar110,fVar102))));
        auVar51._4_4_ = auVar148._4_4_ * fVar194;
        auVar51._0_4_ = auVar148._0_4_ * fVar191;
        auVar51._8_4_ = auVar148._8_4_ * fVar195;
        auVar51._12_4_ = auVar148._12_4_ * fVar196;
        auVar51._16_4_ = auVar148._16_4_ * fVar197;
        auVar51._20_4_ = auVar148._20_4_ * fVar198;
        auVar51._24_4_ = auVar148._24_4_ * fVar199;
        auVar51._28_4_ = 0;
        auVar103 = vfmadd213ps_fma(local_2d60,auVar143,auVar51);
        auVar140 = vfmadd213ps_fma(local_2d00,auVar142,ZEXT1632(auVar103));
        auVar94 = vrcpps_avx(auVar93);
        auVar182._8_4_ = 0x3f800000;
        auVar182._0_8_ = &DAT_3f8000003f800000;
        auVar182._12_4_ = 0x3f800000;
        auVar182._16_4_ = 0x3f800000;
        auVar182._20_4_ = 0x3f800000;
        auVar182._24_4_ = 0x3f800000;
        auVar182._28_4_ = 0x3f800000;
        auVar183 = ZEXT3264(auVar182);
        auVar103 = vfnmadd213ps_fma(auVar94,auVar93,auVar182);
        auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar94,auVar94);
        auVar185 = ZEXT1632(CONCAT412(auVar103._12_4_ * (auVar140._12_4_ + auVar140._12_4_),
                                      CONCAT48(auVar103._8_4_ * (auVar140._8_4_ + auVar140._8_4_),
                                               CONCAT44(auVar103._4_4_ *
                                                        (auVar140._4_4_ + auVar140._4_4_),
                                                        auVar103._0_4_ *
                                                        (auVar140._0_4_ + auVar140._0_4_)))));
        auVar150 = ZEXT3264(auVar185);
        auVar94 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar185,2);
        auVar144 = vcmpps_avx(auVar185,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar94 = vandps_avx(auVar144,auVar94);
        auVar171._0_8_ = CONCAT44(fVar110,fVar102) ^ 0x8000000080000000;
        auVar171._8_4_ = -fVar112;
        auVar171._12_4_ = -fVar114;
        auVar171._16_4_ = 0x80000000;
        auVar171._20_4_ = 0x80000000;
        auVar171._24_4_ = 0x80000000;
        auVar171._28_4_ = 0x80000000;
        auVar144 = vcmpps_avx(auVar171,auVar93,4);
        auVar94 = vandps_avx(auVar144,auVar94);
        auVar94 = vpslld_avx2(auVar94,0x1f);
        auVar94 = vpsrad_avx2(auVar94,0x1f);
        auVar163 = ZEXT3264(auVar128);
        auVar144 = auVar128 & auVar94;
        auVar94 = vandps_avx(auVar94,auVar128);
        local_2c80 = auVar146;
        local_2c40 = auVar128;
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar144 >> 0x7f,0) != '\0') ||
              (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0xbf,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar144[0x1f] < '\0') {
          local_2860 = auVar148;
          local_2840 = auVar143;
          local_2820 = auVar142;
          local_2800 = auVar185;
          local_27e0 = auVar146;
          _local_27c0 = ZEXT1632(auVar17);
          _local_27a0 = auVar133;
        }
      }
      auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
      auVar148 = vpcmpeqd_avx2(auVar180,auVar180);
      auVar193 = ZEXT3264(auVar148);
      uVar6 = *(uint *)(local_2e00.super_Precalculations.grid + 0x18);
      pGVar8 = (context->scene->geometries).items[uVar6].ptr;
      uVar4 = pGVar8->mask;
      auVar96._4_4_ = uVar4;
      auVar96._0_4_ = uVar4;
      auVar96._8_4_ = uVar4;
      auVar96._12_4_ = uVar4;
      auVar96._16_4_ = uVar4;
      auVar96._20_4_ = uVar4;
      auVar96._24_4_ = uVar4;
      auVar96._28_4_ = uVar4;
      auVar128 = vpand_avx2(auVar96,*(undefined1 (*) [32])(ray + 0x120));
      auVar142 = vpcmpeqd_avx2(auVar128,_DAT_02020f00);
      auVar128 = auVar94 & ~auVar142;
      local_2dc0 = auVar149;
      if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar128 >> 0x7f,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar128 >> 0xbf,0) != '\0') ||
          (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar128[0x1f] < '\0') {
        uVar74 = *(undefined4 *)(local_2e00.super_Precalculations.grid + 0x1c);
        auVar128 = vandnps_avx(auVar142,auVar94);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar94 = vandps_avx(local_2da0,local_27e0);
          auVar149 = vrcpps_avx(local_27e0);
          auVar159._8_4_ = 0x3f800000;
          auVar159._0_8_ = &DAT_3f8000003f800000;
          auVar159._12_4_ = 0x3f800000;
          auVar159._16_4_ = 0x3f800000;
          auVar159._20_4_ = 0x3f800000;
          auVar159._24_4_ = 0x3f800000;
          auVar159._28_4_ = 0x3f800000;
          auVar103 = vfnmadd213ps_fma(auVar149,local_27e0,auVar159);
          auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar149,auVar149);
          auVar123._8_4_ = 0x219392ef;
          auVar123._0_8_ = 0x219392ef219392ef;
          auVar123._12_4_ = 0x219392ef;
          auVar123._16_4_ = 0x219392ef;
          auVar123._20_4_ = 0x219392ef;
          auVar123._24_4_ = 0x219392ef;
          auVar123._28_4_ = 0x219392ef;
          auVar149 = vcmpps_avx(auVar94,auVar123,5);
          auVar94 = vandps_avx(auVar149,ZEXT1632(auVar103));
          auVar59._4_4_ = auVar94._4_4_ * (float)local_27a0._4_4_;
          auVar59._0_4_ = auVar94._0_4_ * (float)local_27a0._0_4_;
          auVar59._8_4_ = auVar94._8_4_ * fStack_2798;
          auVar59._12_4_ = auVar94._12_4_ * fStack_2794;
          auVar59._16_4_ = auVar94._16_4_ * fStack_2790;
          auVar59._20_4_ = auVar94._20_4_ * fStack_278c;
          auVar59._24_4_ = auVar94._24_4_ * fStack_2788;
          auVar59._28_4_ = auVar149._28_4_;
          auVar142 = vminps_avx(auVar59,auVar159);
          auVar60._4_4_ = auVar94._4_4_ * (float)local_27c0._4_4_;
          auVar60._0_4_ = auVar94._0_4_ * (float)local_27c0._0_4_;
          auVar60._8_4_ = auVar94._8_4_ * fStack_27b8;
          auVar60._12_4_ = auVar94._12_4_ * fStack_27b4;
          auVar60._16_4_ = auVar94._16_4_ * fStack_27b0;
          auVar60._20_4_ = auVar94._20_4_ * fStack_27ac;
          auVar60._24_4_ = auVar94._24_4_ * fStack_27a8;
          auVar60._28_4_ = auVar94._28_4_;
          auVar143 = vminps_avx(auVar60,auVar159);
          uVar5 = *(undefined4 *)(local_2e60 + lVar82);
          auVar135._4_4_ = uVar5;
          auVar135._0_4_ = uVar5;
          auVar135._8_4_ = uVar5;
          auVar135._12_4_ = uVar5;
          auVar135._16_4_ = uVar5;
          auVar135._20_4_ = uVar5;
          auVar135._24_4_ = uVar5;
          auVar135._28_4_ = uVar5;
          uVar5 = *(undefined4 *)(local_2e60 + lVar82 + 4);
          auVar139._4_4_ = uVar5;
          auVar139._0_4_ = uVar5;
          auVar139._8_4_ = uVar5;
          auVar139._12_4_ = uVar5;
          auVar139._16_4_ = uVar5;
          auVar139._20_4_ = uVar5;
          auVar139._24_4_ = uVar5;
          auVar139._28_4_ = uVar5;
          auVar149 = vpsrld_avx2(auVar135,0x10);
          auVar140 = ZEXT816(0) << 0x40;
          auVar94 = vpblendw_avx2(auVar135,ZEXT1632(auVar140),0xaa);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar179._8_4_ = 0x39000000;
          auVar179._0_8_ = 0x3900000039000000;
          auVar179._12_4_ = 0x39000000;
          auVar183 = ZEXT3264(CONCAT428(0x39000000,
                                        CONCAT424(0x39000000,
                                                  CONCAT420(0x39000000,
                                                            CONCAT416(0x39000000,auVar179)))));
          auVar149 = vcvtdq2ps_avx(auVar149);
          auVar144 = vsubps_avx(auVar159,auVar142);
          auVar144 = vsubps_avx(auVar144,auVar143);
          auVar201._0_4_ = auVar144._0_4_ * auVar94._0_4_ * 0.00012207031;
          auVar201._4_4_ = auVar144._4_4_ * auVar94._4_4_ * 0.00012207031;
          auVar201._8_4_ = auVar144._8_4_ * auVar94._8_4_ * 0.00012207031;
          auVar201._12_4_ = auVar144._12_4_ * auVar94._12_4_ * 0.00012207031;
          auVar201._16_4_ = auVar144._16_4_ * auVar94._16_4_ * 0.00012207031;
          auVar201._20_4_ = auVar144._20_4_ * auVar94._20_4_ * 0.00012207031;
          auVar201._28_36_ = auVar163._28_36_;
          auVar201._24_4_ = auVar144._24_4_ * auVar94._24_4_ * 0.00012207031;
          auVar61._4_4_ = auVar144._4_4_ * auVar149._4_4_ * 0.00012207031;
          auVar61._0_4_ = auVar144._0_4_ * auVar149._0_4_ * 0.00012207031;
          auVar61._8_4_ = auVar144._8_4_ * auVar149._8_4_ * 0.00012207031;
          auVar61._12_4_ = auVar144._12_4_ * auVar149._12_4_ * 0.00012207031;
          auVar61._16_4_ = auVar144._16_4_ * auVar149._16_4_ * 0.00012207031;
          auVar61._20_4_ = auVar144._20_4_ * auVar149._20_4_ * 0.00012207031;
          auVar61._24_4_ = auVar144._24_4_ * auVar149._24_4_ * 0.00012207031;
          auVar61._28_4_ = auVar94._28_4_;
          auVar94 = vpblendw_avx2(auVar139,ZEXT1632(auVar140),0xaa);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar141._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar141._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar141._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar141._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar62._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar62._0_16_ = auVar141;
          auVar62._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar62._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar62._28_4_ = auVar94._28_4_;
          auVar150 = ZEXT3264(auVar62);
          auVar103 = vfmadd231ps_fma(auVar201._0_32_,auVar143,auVar62);
          auVar94 = vpsrld_avx2(auVar139,0x10);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar63._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar63._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar63._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar63._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar63._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar63._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar63._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar63._28_4_ = auVar94._28_4_;
          auVar17 = vfmadd231ps_fma(auVar61,auVar143,auVar63);
          uVar5 = *(undefined4 *)(local_2e68 + lVar82);
          auVar124._4_4_ = uVar5;
          auVar124._0_4_ = uVar5;
          auVar124._8_4_ = uVar5;
          auVar124._12_4_ = uVar5;
          auVar124._16_4_ = uVar5;
          auVar124._20_4_ = uVar5;
          auVar124._24_4_ = uVar5;
          auVar124._28_4_ = uVar5;
          auVar94 = vpblendw_avx2(auVar124,ZEXT1632(auVar140),0xaa);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar64._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar64._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar64._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar64._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar64._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar64._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar64._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar64._28_4_ = auVar94._28_4_;
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar142,auVar64);
          auVar163 = ZEXT1664(auVar103);
          auVar94 = vpsrld_avx2(auVar124,0x10);
          auVar94 = vcvtdq2ps_avx(auVar94);
          auVar65._4_4_ = auVar94._4_4_ * 0.00012207031;
          auVar65._0_4_ = auVar94._0_4_ * 0.00012207031;
          auVar65._8_4_ = auVar94._8_4_ * 0.00012207031;
          auVar65._12_4_ = auVar94._12_4_ * 0.00012207031;
          auVar65._16_4_ = auVar94._16_4_ * 0.00012207031;
          auVar65._20_4_ = auVar94._20_4_ * 0.00012207031;
          auVar65._24_4_ = auVar94._24_4_ * 0.00012207031;
          auVar65._28_4_ = auVar94._28_4_;
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar142,auVar65);
          local_2b80 = local_2820._0_8_;
          uStack_2b78 = local_2820._8_8_;
          uStack_2b70 = local_2820._16_8_;
          uStack_2b68 = local_2820._24_8_;
          local_2b60 = local_2840._0_8_;
          uStack_2b58 = local_2840._8_8_;
          uStack_2b50 = local_2840._16_8_;
          uStack_2b48 = local_2840._24_8_;
          local_2b40 = local_2860._0_8_;
          uStack_2b38 = local_2860._8_8_;
          uStack_2b30 = local_2860._16_8_;
          uStack_2b28 = local_2860._24_8_;
          local_2b20 = ZEXT1632(auVar103);
          local_2b00 = ZEXT1632(auVar17);
          local_2ae0._4_4_ = uVar74;
          local_2ae0._0_4_ = uVar74;
          local_2ae0._8_4_ = uVar74;
          local_2ae0._12_4_ = uVar74;
          local_2ae0._16_4_ = uVar74;
          local_2ae0._20_4_ = uVar74;
          local_2ae0._24_4_ = uVar74;
          local_2ae0._28_4_ = uVar74;
          local_2aa0 = context->user->instID[0];
          local_2a80 = context->user->instPrimID[0];
          auVar94 = *(undefined1 (*) [32])(ray + 0x100);
          auVar149 = vblendvps_avx(auVar94,local_2800,auVar128);
          *(undefined1 (*) [32])(ray + 0x100) = auVar149;
          local_2df0.valid = (int *)local_2d40;
          local_2df0.geometryUserPtr = pGVar8->userPtr;
          local_2df0.context = context->user;
          local_2df0.hit = (RTCHitN *)&local_2b80;
          local_2df0.N = 8;
          local_2df0.ray = (RTCRayN *)ray;
          local_2d40 = auVar128;
          local_2ac0 = uVar6;
          uStack_2abc = uVar6;
          uStack_2ab8 = uVar6;
          uStack_2ab4 = uVar6;
          uStack_2ab0 = uVar6;
          uStack_2aac = uVar6;
          uStack_2aa8 = uVar6;
          uStack_2aa4 = uVar6;
          uStack_2a9c = local_2aa0;
          uStack_2a98 = local_2aa0;
          uStack_2a94 = local_2aa0;
          uStack_2a90 = local_2aa0;
          uStack_2a8c = local_2aa0;
          uStack_2a88 = local_2aa0;
          uStack_2a84 = local_2aa0;
          uStack_2a7c = local_2a80;
          uStack_2a78 = local_2a80;
          uStack_2a74 = local_2a80;
          uStack_2a70 = local_2a80;
          uStack_2a6c = local_2a80;
          uStack_2a68 = local_2a80;
          uStack_2a64 = local_2a80;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar150 = ZEXT1664(auVar141);
            auVar163 = ZEXT1664(auVar103);
            auVar183 = ZEXT1664(auVar179);
            auVar128 = ZEXT1632(auVar148._0_16_);
            (*pGVar8->occlusionFilterN)(&local_2df0);
            auVar128 = vpcmpeqd_avx2(auVar128,auVar128);
            auVar193 = ZEXT3264(auVar128);
            auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar186 = ZEXT3264(local_2da0);
          }
          auVar128 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2d40);
          auVar148 = auVar193._0_32_ & ~auVar128;
          if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar148 >> 0x7f,0) == '\0') &&
                (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar148 >> 0xbf,0) == '\0') &&
              (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar148[0x1f]) {
            auVar128 = auVar193._0_32_ ^ auVar128;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              auVar150 = ZEXT1664(auVar150._0_16_);
              auVar163 = ZEXT1664(auVar163._0_16_);
              auVar183 = ZEXT1664(auVar183._0_16_);
              auVar128 = ZEXT1632(auVar193._0_16_);
              (*p_Var9)(&local_2df0);
              auVar128 = vpcmpeqd_avx2(auVar128,auVar128);
              auVar193 = ZEXT3264(auVar128);
              auVar190 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              auVar187 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar186 = ZEXT3264(local_2da0);
            }
            auVar148 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2d40);
            auVar128 = auVar193._0_32_ ^ auVar148;
            auVar126._8_4_ = 0xff800000;
            auVar126._0_8_ = 0xff800000ff800000;
            auVar126._12_4_ = 0xff800000;
            auVar126._16_4_ = 0xff800000;
            auVar126._20_4_ = 0xff800000;
            auVar126._24_4_ = 0xff800000;
            auVar126._28_4_ = 0xff800000;
            auVar148 = vblendvps_avx(auVar126,*(undefined1 (*) [32])(local_2df0.ray + 0x100),
                                     auVar148);
            *(undefined1 (*) [32])(local_2df0.ray + 0x100) = auVar148;
          }
          auVar94 = vblendvps_avx(auVar94,*(undefined1 (*) [32])pRVar1,auVar128);
          *(undefined1 (*) [32])pRVar1 = auVar94;
        }
        auVar149 = vandnps_avx(auVar128,local_2dc0);
      }
      auVar201 = ZEXT3264(auVar149);
      lVar82 = lVar82 + 4;
    } while ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar149 >> 0x7f,0) != '\0') ||
               (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar149 >> 0xbf,0) != '\0') ||
             (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar149[0x1f] < '\0');
    if (iVar72 == 2) break;
  }
  auVar97._0_4_ = auVar193._0_4_ ^ auVar201._0_4_;
  auVar97._4_4_ = auVar193._4_4_ ^ auVar201._4_4_;
  auVar97._8_4_ = auVar193._8_4_ ^ auVar201._8_4_;
  auVar97._12_4_ = auVar193._12_4_ ^ auVar201._12_4_;
  auVar97._16_4_ = auVar193._16_4_ ^ auVar201._16_4_;
  auVar97._20_4_ = auVar193._20_4_ ^ auVar201._20_4_;
  auVar97._24_4_ = auVar193._24_4_ ^ auVar201._24_4_;
  auVar97._28_4_ = auVar193._28_4_ ^ auVar201._28_4_;
  pRVar76 = (RTCIntersectArguments *)0x0;
LAB_005c1f6b:
  local_2cc0 = vorps_avx(auVar97,local_2cc0);
  auVar128 = auVar193._0_32_ & ~local_2cc0;
  if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar128 >> 0x7f,0) == '\0') &&
        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar128 >> 0xbf,0) == '\0') &&
      (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar128[0x1f]) {
LAB_005c1fc7:
    iVar72 = 3;
  }
  else {
    auVar127._8_4_ = 0xff800000;
    auVar127._0_8_ = 0xff800000ff800000;
    auVar127._12_4_ = 0xff800000;
    auVar127._16_4_ = 0xff800000;
    auVar127._20_4_ = 0xff800000;
    auVar127._24_4_ = 0xff800000;
    auVar127._28_4_ = 0xff800000;
    local_28c0 = vblendvps_avx(local_28c0,auVar127,local_2cc0);
    iVar72 = 0;
    if (pRVar76 != (RTCIntersectArguments *)0x0) {
      *puVar81 = (ulong)pRVar76;
      puVar81 = puVar81 + 1;
      *(undefined4 *)*pauVar78 = 0xff800000;
      *(undefined4 *)(*pauVar78 + 4) = 0xff800000;
      *(undefined4 *)(*pauVar78 + 8) = 0xff800000;
      *(undefined4 *)(*pauVar78 + 0xc) = 0xff800000;
      *(undefined4 *)(*pauVar78 + 0x10) = 0xff800000;
      *(undefined4 *)(*pauVar78 + 0x14) = 0xff800000;
      *(undefined4 *)(*pauVar78 + 0x18) = 0xff800000;
      *(undefined4 *)(*pauVar78 + 0x1c) = 0xff800000;
      pauVar78 = pauVar78 + 1;
      iVar72 = 0;
    }
  }
LAB_005c1fca:
  if (iVar72 == 3) {
    auVar128 = vandps_avx(local_2880,local_2cc0);
    auVar108._8_4_ = 0xff800000;
    auVar108._0_8_ = 0xff800000ff800000;
    auVar108._12_4_ = 0xff800000;
    auVar108._16_4_ = 0xff800000;
    auVar108._20_4_ = 0xff800000;
    auVar108._24_4_ = 0xff800000;
    auVar108._28_4_ = 0xff800000;
    auVar128 = vmaskmovps_avx(auVar128,auVar108);
    *(undefined1 (*) [32])pRVar1 = auVar128;
    return;
  }
  goto LAB_005c0ab5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }